

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersector1<8>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  long lVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  byte bVar64;
  uint uVar65;
  ulong uVar66;
  bool bVar67;
  uint uVar68;
  long lVar69;
  ulong uVar70;
  ulong uVar71;
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar104;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar77 [16];
  float fVar102;
  float fVar103;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar108 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar109 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  float t1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar171;
  float fVar190;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar188;
  float fVar189;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar194;
  float fVar215;
  float fVar216;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar210 [32];
  float fVar217;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  float fVar221;
  float fVar234;
  float fVar235;
  vfloat4 b0;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar237;
  float fVar239;
  float fVar240;
  undefined1 auVar231 [32];
  float fVar236;
  undefined1 auVar232 [32];
  undefined1 auVar238 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  float fVar270;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar263 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar271;
  undefined1 auVar268 [32];
  float fVar272;
  undefined1 auVar269 [64];
  vfloat4 a0_1;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar275 [16];
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [64];
  __m128 a;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar288 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [64];
  float fVar304;
  float fVar310;
  undefined1 auVar305 [16];
  float fVar308;
  float fVar309;
  float fVar311;
  float fVar312;
  float fVar313;
  float in_register_0000151c;
  undefined1 auVar306 [32];
  float fVar314;
  undefined1 auVar307 [64];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  float fVar319;
  undefined1 auVar318 [64];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  float in_register_0000159c;
  undefined1 auVar324 [32];
  float fVar329;
  vfloat4 a0;
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  float in_register_000015dc;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  ulong local_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 auStack_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float fStack_440;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float fStack_420;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float fStack_340;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  ulong local_310;
  RTCFilterFunctionNArguments local_308;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 auStack_2a8 [16];
  uint auStack_298 [4];
  undefined8 local_288;
  undefined4 local_280;
  undefined8 local_27c;
  undefined4 local_274;
  undefined4 local_270;
  uint local_26c;
  uint local_268;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [32];
  float afStack_1b8 [8];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar233 [32];
  undefined1 auVar325 [32];
  
  PVar7 = prim[1];
  uVar71 = (ulong)(byte)PVar7;
  lVar69 = uVar71 * 5;
  fVar194 = *(float *)(prim + uVar71 * 0x19 + 0x12);
  auVar151 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar71 * 0x19 + 6));
  auVar195._0_4_ = fVar194 * (ray->dir).field_0.m128[0];
  auVar195._4_4_ = fVar194 * (ray->dir).field_0.m128[1];
  auVar195._8_4_ = fVar194 * (ray->dir).field_0.m128[2];
  auVar195._12_4_ = fVar194 * (ray->dir).field_0.m128[3];
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 10)));
  auVar105._0_4_ = fVar194 * auVar151._0_4_;
  auVar105._4_4_ = fVar194 * auVar151._4_4_;
  auVar105._8_4_ = fVar194 * auVar151._8_4_;
  auVar105._12_4_ = fVar194 * auVar151._12_4_;
  auVar92._16_16_ = auVar260;
  auVar92._0_16_ = auVar81;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar69 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar69 + 10)));
  auVar153._16_16_ = auVar260;
  auVar153._0_16_ = auVar81;
  auVar13 = vcvtdq2ps_avx(auVar153);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 10)));
  auVar166._16_16_ = auVar260;
  auVar166._0_16_ = auVar81;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xb + 6)));
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xb + 10)));
  auVar14 = vcvtdq2ps_avx(auVar166);
  auVar167._16_16_ = auVar260;
  auVar167._0_16_ = auVar81;
  auVar15 = vcvtdq2ps_avx(auVar167);
  uVar70 = (ulong)((uint)(byte)PVar7 * 0xc);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + 6)));
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + 10)));
  auVar231._16_16_ = auVar260;
  auVar231._0_16_ = auVar81;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + uVar71 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar231);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + uVar71 + 10)));
  auVar248._16_16_ = auVar260;
  auVar248._0_16_ = auVar81;
  lVar12 = uVar71 * 9;
  uVar70 = (ulong)(uint)((int)lVar12 * 2);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar248);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + 10)));
  auVar249._16_16_ = auVar260;
  auVar249._0_16_ = auVar81;
  auVar18 = vcvtdq2ps_avx(auVar249);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + uVar71 + 6)));
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + uVar71 + 10)));
  auVar281._16_16_ = auVar260;
  auVar281._0_16_ = auVar81;
  uVar70 = (ulong)(uint)((int)lVar69 << 2);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + 6)));
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + 10)));
  auVar19 = vcvtdq2ps_avx(auVar281);
  auVar291._16_16_ = auVar260;
  auVar291._0_16_ = auVar81;
  auVar20 = vcvtdq2ps_avx(auVar291);
  auVar81 = vshufps_avx(auVar195,auVar195,0);
  auVar260 = vshufps_avx(auVar195,auVar195,0x55);
  auVar151 = vshufps_avx(auVar195,auVar195,0xaa);
  fVar194 = auVar151._0_4_;
  fVar221 = auVar151._4_4_;
  fVar215 = auVar151._8_4_;
  fVar234 = auVar151._12_4_;
  fVar216 = auVar260._0_4_;
  fVar235 = auVar260._4_4_;
  fVar217 = auVar260._8_4_;
  fVar236 = auVar260._12_4_;
  fVar218 = auVar81._0_4_;
  fVar237 = auVar81._4_4_;
  fVar219 = auVar81._8_4_;
  fVar239 = auVar81._12_4_;
  auVar306._0_4_ = fVar218 * auVar92._0_4_ + fVar216 * auVar13._0_4_ + fVar194 * auVar14._0_4_;
  auVar306._4_4_ = fVar237 * auVar92._4_4_ + fVar235 * auVar13._4_4_ + fVar221 * auVar14._4_4_;
  auVar306._8_4_ = fVar219 * auVar92._8_4_ + fVar217 * auVar13._8_4_ + fVar215 * auVar14._8_4_;
  auVar306._12_4_ = fVar239 * auVar92._12_4_ + fVar236 * auVar13._12_4_ + fVar234 * auVar14._12_4_;
  auVar306._16_4_ = fVar218 * auVar92._16_4_ + fVar216 * auVar13._16_4_ + fVar194 * auVar14._16_4_;
  auVar306._20_4_ = fVar237 * auVar92._20_4_ + fVar235 * auVar13._20_4_ + fVar221 * auVar14._20_4_;
  auVar306._24_4_ = fVar219 * auVar92._24_4_ + fVar217 * auVar13._24_4_ + fVar215 * auVar14._24_4_;
  auVar306._28_4_ = fVar236 + in_register_000015dc + in_register_0000151c;
  auVar300._0_4_ = fVar218 * auVar15._0_4_ + fVar216 * auVar16._0_4_ + auVar17._0_4_ * fVar194;
  auVar300._4_4_ = fVar237 * auVar15._4_4_ + fVar235 * auVar16._4_4_ + auVar17._4_4_ * fVar221;
  auVar300._8_4_ = fVar219 * auVar15._8_4_ + fVar217 * auVar16._8_4_ + auVar17._8_4_ * fVar215;
  auVar300._12_4_ = fVar239 * auVar15._12_4_ + fVar236 * auVar16._12_4_ + auVar17._12_4_ * fVar234;
  auVar300._16_4_ = fVar218 * auVar15._16_4_ + fVar216 * auVar16._16_4_ + auVar17._16_4_ * fVar194;
  auVar300._20_4_ = fVar237 * auVar15._20_4_ + fVar235 * auVar16._20_4_ + auVar17._20_4_ * fVar221;
  auVar300._24_4_ = fVar219 * auVar15._24_4_ + fVar217 * auVar16._24_4_ + auVar17._24_4_ * fVar215;
  auVar300._28_4_ = fVar236 + in_register_000015dc + in_register_0000159c;
  auVar210._0_4_ = fVar218 * auVar18._0_4_ + fVar216 * auVar19._0_4_ + auVar20._0_4_ * fVar194;
  auVar210._4_4_ = fVar237 * auVar18._4_4_ + fVar235 * auVar19._4_4_ + auVar20._4_4_ * fVar221;
  auVar210._8_4_ = fVar219 * auVar18._8_4_ + fVar217 * auVar19._8_4_ + auVar20._8_4_ * fVar215;
  auVar210._12_4_ = fVar239 * auVar18._12_4_ + fVar236 * auVar19._12_4_ + auVar20._12_4_ * fVar234;
  auVar210._16_4_ = fVar218 * auVar18._16_4_ + fVar216 * auVar19._16_4_ + auVar20._16_4_ * fVar194;
  auVar210._20_4_ = fVar237 * auVar18._20_4_ + fVar235 * auVar19._20_4_ + auVar20._20_4_ * fVar221;
  auVar210._24_4_ = fVar219 * auVar18._24_4_ + fVar217 * auVar19._24_4_ + auVar20._24_4_ * fVar215;
  auVar210._28_4_ = fVar239 + fVar236 + fVar234;
  auVar81 = vshufps_avx(auVar105,auVar105,0);
  auVar260 = vshufps_avx(auVar105,auVar105,0x55);
  auVar151 = vshufps_avx(auVar105,auVar105,0xaa);
  fVar221 = auVar151._0_4_;
  fVar215 = auVar151._4_4_;
  fVar234 = auVar151._8_4_;
  fVar216 = auVar151._12_4_;
  fVar237 = auVar260._0_4_;
  fVar219 = auVar260._4_4_;
  fVar239 = auVar260._8_4_;
  fVar220 = auVar260._12_4_;
  fVar235 = auVar81._0_4_;
  fVar217 = auVar81._4_4_;
  fVar236 = auVar81._8_4_;
  fVar218 = auVar81._12_4_;
  fVar194 = auVar92._28_4_;
  auVar127._0_4_ = fVar235 * auVar92._0_4_ + fVar237 * auVar13._0_4_ + fVar221 * auVar14._0_4_;
  auVar127._4_4_ = fVar217 * auVar92._4_4_ + fVar219 * auVar13._4_4_ + fVar215 * auVar14._4_4_;
  auVar127._8_4_ = fVar236 * auVar92._8_4_ + fVar239 * auVar13._8_4_ + fVar234 * auVar14._8_4_;
  auVar127._12_4_ = fVar218 * auVar92._12_4_ + fVar220 * auVar13._12_4_ + fVar216 * auVar14._12_4_;
  auVar127._16_4_ = fVar235 * auVar92._16_4_ + fVar237 * auVar13._16_4_ + fVar221 * auVar14._16_4_;
  auVar127._20_4_ = fVar217 * auVar92._20_4_ + fVar219 * auVar13._20_4_ + fVar215 * auVar14._20_4_;
  auVar127._24_4_ = fVar236 * auVar92._24_4_ + fVar239 * auVar13._24_4_ + fVar234 * auVar14._24_4_;
  auVar127._28_4_ = fVar194 + auVar13._28_4_ + auVar14._28_4_;
  auVar154._0_4_ = fVar235 * auVar15._0_4_ + auVar17._0_4_ * fVar221 + fVar237 * auVar16._0_4_;
  auVar154._4_4_ = fVar217 * auVar15._4_4_ + auVar17._4_4_ * fVar215 + fVar219 * auVar16._4_4_;
  auVar154._8_4_ = fVar236 * auVar15._8_4_ + auVar17._8_4_ * fVar234 + fVar239 * auVar16._8_4_;
  auVar154._12_4_ = fVar218 * auVar15._12_4_ + auVar17._12_4_ * fVar216 + fVar220 * auVar16._12_4_;
  auVar154._16_4_ = fVar235 * auVar15._16_4_ + auVar17._16_4_ * fVar221 + fVar237 * auVar16._16_4_;
  auVar154._20_4_ = fVar217 * auVar15._20_4_ + auVar17._20_4_ * fVar215 + fVar219 * auVar16._20_4_;
  auVar154._24_4_ = fVar236 * auVar15._24_4_ + auVar17._24_4_ * fVar234 + fVar239 * auVar16._24_4_;
  auVar154._28_4_ = fVar194 + auVar17._28_4_ + auVar14._28_4_;
  auVar168._8_4_ = 0x7fffffff;
  auVar168._0_8_ = 0x7fffffff7fffffff;
  auVar168._12_4_ = 0x7fffffff;
  auVar168._16_4_ = 0x7fffffff;
  auVar168._20_4_ = 0x7fffffff;
  auVar168._24_4_ = 0x7fffffff;
  auVar168._28_4_ = 0x7fffffff;
  auVar185._8_4_ = 0x219392ef;
  auVar185._0_8_ = 0x219392ef219392ef;
  auVar185._12_4_ = 0x219392ef;
  auVar185._16_4_ = 0x219392ef;
  auVar185._20_4_ = 0x219392ef;
  auVar185._24_4_ = 0x219392ef;
  auVar185._28_4_ = 0x219392ef;
  auVar92 = vandps_avx(auVar306,auVar168);
  auVar92 = vcmpps_avx(auVar92,auVar185,1);
  auVar13 = vblendvps_avx(auVar306,auVar185,auVar92);
  auVar92 = vandps_avx(auVar300,auVar168);
  auVar92 = vcmpps_avx(auVar92,auVar185,1);
  auVar14 = vblendvps_avx(auVar300,auVar185,auVar92);
  auVar92 = vandps_avx(auVar210,auVar168);
  auVar92 = vcmpps_avx(auVar92,auVar185,1);
  auVar92 = vblendvps_avx(auVar210,auVar185,auVar92);
  auVar169._0_4_ = fVar235 * auVar18._0_4_ + fVar237 * auVar19._0_4_ + auVar20._0_4_ * fVar221;
  auVar169._4_4_ = fVar217 * auVar18._4_4_ + fVar219 * auVar19._4_4_ + auVar20._4_4_ * fVar215;
  auVar169._8_4_ = fVar236 * auVar18._8_4_ + fVar239 * auVar19._8_4_ + auVar20._8_4_ * fVar234;
  auVar169._12_4_ = fVar218 * auVar18._12_4_ + fVar220 * auVar19._12_4_ + auVar20._12_4_ * fVar216;
  auVar169._16_4_ = fVar235 * auVar18._16_4_ + fVar237 * auVar19._16_4_ + auVar20._16_4_ * fVar221;
  auVar169._20_4_ = fVar217 * auVar18._20_4_ + fVar219 * auVar19._20_4_ + auVar20._20_4_ * fVar215;
  auVar169._24_4_ = fVar236 * auVar18._24_4_ + fVar239 * auVar19._24_4_ + auVar20._24_4_ * fVar234;
  auVar169._28_4_ = fVar194 + auVar16._28_4_ + fVar216;
  auVar15 = vrcpps_avx(auVar13);
  fVar194 = auVar15._0_4_;
  fVar215 = auVar15._4_4_;
  auVar16._4_4_ = auVar13._4_4_ * fVar215;
  auVar16._0_4_ = auVar13._0_4_ * fVar194;
  fVar216 = auVar15._8_4_;
  auVar16._8_4_ = auVar13._8_4_ * fVar216;
  fVar217 = auVar15._12_4_;
  auVar16._12_4_ = auVar13._12_4_ * fVar217;
  fVar218 = auVar15._16_4_;
  auVar16._16_4_ = auVar13._16_4_ * fVar218;
  fVar219 = auVar15._20_4_;
  auVar16._20_4_ = auVar13._20_4_ * fVar219;
  fVar220 = auVar15._24_4_;
  auVar16._24_4_ = auVar13._24_4_ * fVar220;
  auVar16._28_4_ = auVar210._28_4_;
  auVar250._8_4_ = 0x3f800000;
  auVar250._0_8_ = 0x3f8000003f800000;
  auVar250._12_4_ = 0x3f800000;
  auVar250._16_4_ = 0x3f800000;
  auVar250._20_4_ = 0x3f800000;
  auVar250._24_4_ = 0x3f800000;
  auVar250._28_4_ = 0x3f800000;
  auVar16 = vsubps_avx(auVar250,auVar16);
  auVar13 = vrcpps_avx(auVar14);
  fVar194 = fVar194 + fVar194 * auVar16._0_4_;
  fVar215 = fVar215 + fVar215 * auVar16._4_4_;
  fVar216 = fVar216 + fVar216 * auVar16._8_4_;
  fVar217 = fVar217 + fVar217 * auVar16._12_4_;
  fVar218 = fVar218 + fVar218 * auVar16._16_4_;
  fVar219 = fVar219 + fVar219 * auVar16._20_4_;
  fVar220 = fVar220 + fVar220 * auVar16._24_4_;
  fVar221 = auVar13._0_4_;
  fVar234 = auVar13._4_4_;
  auVar17._4_4_ = auVar14._4_4_ * fVar234;
  auVar17._0_4_ = auVar14._0_4_ * fVar221;
  fVar235 = auVar13._8_4_;
  auVar17._8_4_ = auVar14._8_4_ * fVar235;
  fVar236 = auVar13._12_4_;
  auVar17._12_4_ = auVar14._12_4_ * fVar236;
  fVar237 = auVar13._16_4_;
  auVar17._16_4_ = auVar14._16_4_ * fVar237;
  fVar239 = auVar13._20_4_;
  auVar17._20_4_ = auVar14._20_4_ * fVar239;
  fVar240 = auVar13._24_4_;
  auVar17._24_4_ = auVar14._24_4_ * fVar240;
  auVar17._28_4_ = auVar15._28_4_;
  auVar13 = vsubps_avx(auVar250,auVar17);
  fVar221 = fVar221 + fVar221 * auVar13._0_4_;
  fVar234 = fVar234 + fVar234 * auVar13._4_4_;
  fVar235 = fVar235 + fVar235 * auVar13._8_4_;
  fVar236 = fVar236 + fVar236 * auVar13._12_4_;
  fVar237 = fVar237 + fVar237 * auVar13._16_4_;
  fVar239 = fVar239 + fVar239 * auVar13._20_4_;
  fVar240 = fVar240 + fVar240 * auVar13._24_4_;
  auVar13 = vrcpps_avx(auVar92);
  fVar171 = auVar13._0_4_;
  fVar188 = auVar13._4_4_;
  auVar14._4_4_ = fVar188 * auVar92._4_4_;
  auVar14._0_4_ = fVar171 * auVar92._0_4_;
  fVar189 = auVar13._8_4_;
  auVar14._8_4_ = fVar189 * auVar92._8_4_;
  fVar190 = auVar13._12_4_;
  auVar14._12_4_ = fVar190 * auVar92._12_4_;
  fVar191 = auVar13._16_4_;
  auVar14._16_4_ = fVar191 * auVar92._16_4_;
  fVar192 = auVar13._20_4_;
  auVar14._20_4_ = fVar192 * auVar92._20_4_;
  fVar193 = auVar13._24_4_;
  auVar14._24_4_ = fVar193 * auVar92._24_4_;
  auVar14._28_4_ = auVar92._28_4_;
  auVar92 = vsubps_avx(auVar250,auVar14);
  fVar171 = fVar171 + fVar171 * auVar92._0_4_;
  fVar188 = fVar188 + fVar188 * auVar92._4_4_;
  fVar189 = fVar189 + fVar189 * auVar92._8_4_;
  fVar190 = fVar190 + fVar190 * auVar92._12_4_;
  fVar191 = fVar191 + fVar191 * auVar92._16_4_;
  fVar192 = fVar192 + fVar192 * auVar92._20_4_;
  fVar193 = fVar193 + fVar193 * auVar92._24_4_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar260._8_8_ = 0;
  auVar260._0_8_ = *(ulong *)(prim + uVar71 * 7 + 0xe);
  auVar260 = vpmovsxwd_avx(auVar260);
  auVar93._16_16_ = auVar260;
  auVar93._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar93);
  auVar92 = vsubps_avx(auVar92,auVar127);
  auVar73._0_4_ = fVar194 * auVar92._0_4_;
  auVar73._4_4_ = fVar215 * auVar92._4_4_;
  auVar73._8_4_ = fVar216 * auVar92._8_4_;
  auVar73._12_4_ = fVar217 * auVar92._12_4_;
  auVar15._16_4_ = fVar218 * auVar92._16_4_;
  auVar15._0_16_ = auVar73;
  auVar15._20_4_ = fVar219 * auVar92._20_4_;
  auVar15._24_4_ = fVar220 * auVar92._24_4_;
  auVar15._28_4_ = auVar92._28_4_;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + lVar12 + 6);
  auVar81 = vpmovsxwd_avx(auVar151);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + lVar12 + 0xe);
  auVar260 = vpmovsxwd_avx(auVar122);
  auVar251._16_16_ = auVar260;
  auVar251._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar251);
  auVar92 = vsubps_avx(auVar92,auVar127);
  auVar106._0_4_ = fVar194 * auVar92._0_4_;
  auVar106._4_4_ = fVar215 * auVar92._4_4_;
  auVar106._8_4_ = fVar216 * auVar92._8_4_;
  auVar106._12_4_ = fVar217 * auVar92._12_4_;
  auVar18._16_4_ = fVar218 * auVar92._16_4_;
  auVar18._0_16_ = auVar106;
  auVar18._20_4_ = fVar219 * auVar92._20_4_;
  auVar18._24_4_ = fVar220 * auVar92._24_4_;
  auVar18._28_4_ = auVar92._28_4_;
  lVar69 = (ulong)(byte)PVar7 * 0x10;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + lVar69 + 6);
  auVar81 = vpmovsxwd_avx(auVar111);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + lVar69 + 0xe);
  auVar260 = vpmovsxwd_avx(auVar141);
  lVar69 = lVar69 + uVar71 * -2;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + lVar69 + 6);
  auVar151 = vpmovsxwd_avx(auVar112);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *(ulong *)(prim + lVar69 + 0xe);
  auVar122 = vpmovsxwd_avx(auVar238);
  auVar211._16_16_ = auVar122;
  auVar211._0_16_ = auVar151;
  auVar92 = vcvtdq2ps_avx(auVar211);
  auVar92 = vsubps_avx(auVar92,auVar154);
  auVar196._0_4_ = fVar221 * auVar92._0_4_;
  auVar196._4_4_ = fVar234 * auVar92._4_4_;
  auVar196._8_4_ = fVar235 * auVar92._8_4_;
  auVar196._12_4_ = fVar236 * auVar92._12_4_;
  auVar19._16_4_ = fVar237 * auVar92._16_4_;
  auVar19._0_16_ = auVar196;
  auVar19._20_4_ = fVar239 * auVar92._20_4_;
  auVar19._24_4_ = fVar240 * auVar92._24_4_;
  auVar19._28_4_ = auVar92._28_4_;
  auVar252._16_16_ = auVar260;
  auVar252._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar252);
  auVar92 = vsubps_avx(auVar92,auVar154);
  auVar135._0_4_ = fVar221 * auVar92._0_4_;
  auVar135._4_4_ = fVar234 * auVar92._4_4_;
  auVar135._8_4_ = fVar235 * auVar92._8_4_;
  auVar135._12_4_ = fVar236 * auVar92._12_4_;
  auVar20._16_4_ = fVar237 * auVar92._16_4_;
  auVar20._0_16_ = auVar135;
  auVar20._20_4_ = fVar239 * auVar92._20_4_;
  auVar20._24_4_ = fVar240 * auVar92._24_4_;
  auVar20._28_4_ = auVar92._28_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar70 + uVar71 + 6);
  auVar81 = vpmovsxwd_avx(auVar5);
  auVar261._8_8_ = 0;
  auVar261._0_8_ = *(ulong *)(prim + uVar70 + uVar71 + 0xe);
  auVar260 = vpmovsxwd_avx(auVar261);
  auVar232._16_16_ = auVar260;
  auVar232._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar232);
  auVar92 = vsubps_avx(auVar92,auVar169);
  auVar222._0_4_ = fVar171 * auVar92._0_4_;
  auVar222._4_4_ = fVar188 * auVar92._4_4_;
  auVar222._8_4_ = fVar189 * auVar92._8_4_;
  auVar222._12_4_ = fVar190 * auVar92._12_4_;
  auVar21._16_4_ = fVar191 * auVar92._16_4_;
  auVar21._0_16_ = auVar222;
  auVar21._20_4_ = fVar192 * auVar92._20_4_;
  auVar21._24_4_ = fVar193 * auVar92._24_4_;
  auVar21._28_4_ = auVar92._28_4_;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar71 * 0x17 + 6);
  auVar81 = vpmovsxwd_avx(auVar201);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar71 * 0x17 + 0xe);
  auVar260 = vpmovsxwd_avx(auVar6);
  auVar253._16_16_ = auVar260;
  auVar253._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar253);
  auVar92 = vsubps_avx(auVar92,auVar169);
  auVar159._0_4_ = fVar171 * auVar92._0_4_;
  auVar159._4_4_ = fVar188 * auVar92._4_4_;
  auVar159._8_4_ = fVar189 * auVar92._8_4_;
  auVar159._12_4_ = fVar190 * auVar92._12_4_;
  auVar22._16_4_ = fVar191 * auVar92._16_4_;
  auVar22._0_16_ = auVar159;
  auVar22._20_4_ = fVar192 * auVar92._20_4_;
  auVar22._24_4_ = fVar193 * auVar92._24_4_;
  auVar22._28_4_ = auVar92._28_4_;
  auVar81 = vpminsd_avx(auVar15._16_16_,auVar18._16_16_);
  auVar260 = vpminsd_avx(auVar73,auVar106);
  auVar292._16_16_ = auVar81;
  auVar292._0_16_ = auVar260;
  auVar81 = vpminsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar260 = vpminsd_avx(auVar196,auVar135);
  auVar301._16_16_ = auVar81;
  auVar301._0_16_ = auVar260;
  auVar92 = vmaxps_avx(auVar292,auVar301);
  auVar81 = vpminsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar260 = vpminsd_avx(auVar222,auVar159);
  auVar317._16_16_ = auVar81;
  auVar317._0_16_ = auVar260;
  uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar324._4_4_ = uVar2;
  auVar324._0_4_ = uVar2;
  auVar324._8_4_ = uVar2;
  auVar324._12_4_ = uVar2;
  auVar324._16_4_ = uVar2;
  auVar324._20_4_ = uVar2;
  auVar324._24_4_ = uVar2;
  auVar324._28_4_ = uVar2;
  auVar13 = vmaxps_avx(auVar317,auVar324);
  auVar92 = vmaxps_avx(auVar92,auVar13);
  local_198._4_4_ = auVar92._4_4_ * 0.99999964;
  local_198._0_4_ = auVar92._0_4_ * 0.99999964;
  local_198._8_4_ = auVar92._8_4_ * 0.99999964;
  local_198._12_4_ = auVar92._12_4_ * 0.99999964;
  local_198._16_4_ = auVar92._16_4_ * 0.99999964;
  local_198._20_4_ = auVar92._20_4_ * 0.99999964;
  local_198._24_4_ = auVar92._24_4_ * 0.99999964;
  local_198._28_4_ = auVar92._28_4_;
  auVar81 = vpmaxsd_avx(auVar15._16_16_,auVar18._16_16_);
  auVar260 = vpmaxsd_avx(auVar73,auVar106);
  auVar94._16_16_ = auVar81;
  auVar94._0_16_ = auVar260;
  auVar81 = vpmaxsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar260 = vpmaxsd_avx(auVar196,auVar135);
  auVar128._16_16_ = auVar81;
  auVar128._0_16_ = auVar260;
  auVar92 = vminps_avx(auVar94,auVar128);
  auVar81 = vpmaxsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar260 = vpmaxsd_avx(auVar222,auVar159);
  auVar129._16_16_ = auVar81;
  auVar129._0_16_ = auVar260;
  fVar194 = ray->tfar;
  auVar155._4_4_ = fVar194;
  auVar155._0_4_ = fVar194;
  auVar155._8_4_ = fVar194;
  auVar155._12_4_ = fVar194;
  auVar155._16_4_ = fVar194;
  auVar155._20_4_ = fVar194;
  auVar155._24_4_ = fVar194;
  auVar155._28_4_ = fVar194;
  auVar13 = vminps_avx(auVar129,auVar155);
  auVar92 = vminps_avx(auVar92,auVar13);
  auVar13._4_4_ = auVar92._4_4_ * 1.0000004;
  auVar13._0_4_ = auVar92._0_4_ * 1.0000004;
  auVar13._8_4_ = auVar92._8_4_ * 1.0000004;
  auVar13._12_4_ = auVar92._12_4_ * 1.0000004;
  auVar13._16_4_ = auVar92._16_4_ * 1.0000004;
  auVar13._20_4_ = auVar92._20_4_ * 1.0000004;
  auVar13._24_4_ = auVar92._24_4_ * 1.0000004;
  auVar13._28_4_ = auVar92._28_4_;
  auVar92 = vcmpps_avx(local_198,auVar13,2);
  auVar81 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar130._16_16_ = auVar81;
  auVar130._0_16_ = auVar81;
  auVar13 = vcvtdq2ps_avx(auVar130);
  auVar13 = vcmpps_avx(_DAT_01faff40,auVar13,1);
  auVar92 = vandps_avx(auVar92,auVar13);
  uVar65 = vmovmskps_avx(auVar92);
  if (uVar65 == 0) {
    return false;
  }
  uVar65 = uVar65 & 0xff;
  auVar95._16_16_ = mm_lookupmask_ps._240_16_;
  auVar95._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar95,ZEXT832(0) << 0x20,0x80);
LAB_01092061:
  uVar71 = (ulong)uVar65;
  lVar69 = 0;
  if (uVar71 != 0) {
    for (; (uVar65 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
    }
  }
  local_4b0 = (ulong)*(uint *)(prim + 2);
  local_310 = (ulong)*(uint *)(prim + lVar69 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[local_4b0].ptr;
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_310);
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var11 + uVar70 * (long)pvVar10);
  fVar194 = *pfVar1;
  fVar221 = pfVar1[1];
  fVar215 = pfVar1[2];
  fVar234 = pfVar1[3];
  pfVar1 = (float *)(_Var11 + (uVar70 + 1) * (long)pvVar10);
  fVar216 = *pfVar1;
  fVar235 = pfVar1[1];
  fVar217 = pfVar1[2];
  fVar236 = pfVar1[3];
  auVar81 = *(undefined1 (*) [16])(_Var11 + (uVar70 + 2) * (long)pvVar10);
  pfVar1 = (float *)(_Var11 + (long)pvVar10 * (uVar70 + 3));
  fVar218 = *pfVar1;
  fVar237 = pfVar1[1];
  fVar219 = pfVar1[2];
  fVar239 = pfVar1[3];
  uVar71 = uVar71 - 1 & uVar71;
  lVar69 = *(long *)&pGVar8[1].time_range.upper;
  pfVar1 = (float *)(lVar69 + (long)p_Var9 * uVar70);
  fVar220 = *pfVar1;
  fVar240 = pfVar1[1];
  fVar171 = pfVar1[2];
  fVar188 = pfVar1[3];
  pfVar1 = (float *)(lVar69 + (long)p_Var9 * (uVar70 + 1));
  fVar189 = *pfVar1;
  fVar190 = pfVar1[1];
  fVar191 = pfVar1[2];
  fVar192 = pfVar1[3];
  pfVar1 = (float *)(lVar69 + (long)p_Var9 * (uVar70 + 2));
  fVar193 = *pfVar1;
  fVar304 = pfVar1[1];
  fVar270 = pfVar1[2];
  fVar308 = pfVar1[3];
  lVar12 = 0;
  if (uVar71 != 0) {
    for (; (uVar71 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  pfVar1 = (float *)(lVar69 + (long)p_Var9 * (uVar70 + 3));
  fVar271 = *pfVar1;
  fVar309 = pfVar1[1];
  fVar272 = pfVar1[2];
  fVar310 = pfVar1[3];
  if (((uVar71 != 0) && (uVar70 = uVar71 - 1 & uVar71, uVar70 != 0)) && (lVar69 = 0, uVar70 != 0)) {
    for (; (uVar70 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
    }
  }
  auVar74._0_4_ = fVar189 * 0.0 + fVar193 * 0.5 + fVar271 * 0.0;
  auVar74._4_4_ = fVar190 * 0.0 + fVar304 * 0.5 + fVar309 * 0.0;
  auVar74._8_4_ = fVar191 * 0.0 + fVar270 * 0.5 + fVar272 * 0.0;
  auVar74._12_4_ = fVar192 * 0.0 + fVar308 * 0.5 + fVar310 * 0.0;
  auVar294._0_4_ = fVar220 * 0.5;
  auVar294._4_4_ = fVar240 * 0.5;
  auVar294._8_4_ = fVar171 * 0.5;
  auVar294._12_4_ = fVar188 * 0.5;
  auVar238 = vsubps_avx(auVar74,auVar294);
  fVar72 = auVar81._0_4_;
  fVar102 = auVar81._4_4_;
  fVar103 = auVar81._8_4_;
  fVar104 = auVar81._12_4_;
  auVar295._0_4_ = fVar216 * 0.0 + fVar72 * 0.5 + fVar218 * 0.0;
  auVar295._4_4_ = fVar235 * 0.0 + fVar102 * 0.5 + fVar237 * 0.0;
  auVar295._8_4_ = fVar217 * 0.0 + fVar103 * 0.5 + fVar219 * 0.0;
  auVar295._12_4_ = fVar236 * 0.0 + fVar104 * 0.5 + fVar239 * 0.0;
  auVar326._0_4_ = fVar194 * 0.5;
  auVar326._4_4_ = fVar221 * 0.5;
  auVar326._8_4_ = fVar215 * 0.5;
  auVar326._12_4_ = fVar234 * 0.5;
  auVar122 = vsubps_avx(auVar295,auVar326);
  local_4c8._0_4_ = fVar220 * -0.0 + fVar189 + fVar193 * 0.0 + fVar271 * -0.0;
  local_4c8._4_4_ = fVar240 * -0.0 + fVar190 + fVar304 * 0.0 + fVar309 * -0.0;
  fStack_4c0 = fVar171 * -0.0 + fVar191 + fVar270 * 0.0 + fVar272 * -0.0;
  fStack_4bc = fVar188 * -0.0 + fVar192 + fVar308 * 0.0 + fVar310 * -0.0;
  auVar107._0_4_ = fVar220 * -0.0 + fVar189 * 0.0 + fVar271 * -0.0 + fVar193;
  auVar107._4_4_ = fVar240 * -0.0 + fVar190 * 0.0 + fVar309 * -0.0 + fVar304;
  auVar107._8_4_ = fVar171 * -0.0 + fVar191 * 0.0 + fVar272 * -0.0 + fVar270;
  auVar107._12_4_ = fVar188 * -0.0 + fVar192 * 0.0 + fVar310 * -0.0 + fVar308;
  auVar273._0_4_ = fVar193 * 0.0 + fVar271 * 0.5;
  auVar273._4_4_ = fVar304 * 0.0 + fVar309 * 0.5;
  auVar273._8_4_ = fVar270 * 0.0 + fVar272 * 0.5;
  auVar273._12_4_ = fVar308 * 0.0 + fVar310 * 0.5;
  auVar327._0_4_ = fVar194 * -0.0 + fVar72 * 0.0 + fVar218 * -0.0 + fVar216;
  auVar327._4_4_ = fVar221 * -0.0 + fVar102 * 0.0 + fVar237 * -0.0 + fVar235;
  auVar327._8_4_ = fVar215 * -0.0 + fVar103 * 0.0 + fVar219 * -0.0 + fVar217;
  auVar327._12_4_ = fVar234 * -0.0 + fVar104 * 0.0 + fVar239 * -0.0 + fVar236;
  auVar256._0_4_ = fVar189 * 0.5;
  auVar256._4_4_ = fVar190 * 0.5;
  auVar256._8_4_ = fVar191 * 0.5;
  auVar256._12_4_ = fVar192 * 0.5;
  auVar81 = vsubps_avx(auVar273,auVar256);
  auVar172._0_4_ = auVar81._0_4_ + fVar220 * 0.0;
  auVar172._4_4_ = auVar81._4_4_ + fVar240 * 0.0;
  auVar172._8_4_ = auVar81._8_4_ + fVar171 * 0.0;
  auVar172._12_4_ = auVar81._12_4_ + fVar188 * 0.0;
  auVar257._0_4_ = fVar194 * -0.0 + fVar216 * 0.0 + fVar218 * -0.0 + fVar72;
  auVar257._4_4_ = fVar221 * -0.0 + fVar235 * 0.0 + fVar237 * -0.0 + fVar102;
  auVar257._8_4_ = fVar215 * -0.0 + fVar217 * 0.0 + fVar219 * -0.0 + fVar103;
  auVar257._12_4_ = fVar234 * -0.0 + fVar236 * 0.0 + fVar239 * -0.0 + fVar104;
  auVar223._0_4_ = fVar72 * 0.0 + fVar218 * 0.5;
  auVar223._4_4_ = fVar102 * 0.0 + fVar237 * 0.5;
  auVar223._8_4_ = fVar103 * 0.0 + fVar219 * 0.5;
  auVar223._12_4_ = fVar104 * 0.0 + fVar239 * 0.5;
  auVar197._0_4_ = fVar216 * 0.5;
  auVar197._4_4_ = fVar235 * 0.5;
  auVar197._8_4_ = fVar217 * 0.5;
  auVar197._12_4_ = fVar236 * 0.5;
  auVar81 = vsubps_avx(auVar223,auVar197);
  auVar198._0_4_ = fVar194 * 0.0 + auVar81._0_4_;
  auVar198._4_4_ = fVar221 * 0.0 + auVar81._4_4_;
  auVar198._8_4_ = fVar215 * 0.0 + auVar81._8_4_;
  auVar198._12_4_ = fVar234 * 0.0 + auVar81._12_4_;
  auVar81 = vshufps_avx(auVar238,auVar238,0xc9);
  auVar260 = vshufps_avx(auVar327,auVar327,0xc9);
  fVar171 = auVar238._0_4_;
  auVar224._0_4_ = fVar171 * auVar260._0_4_;
  fVar188 = auVar238._4_4_;
  auVar224._4_4_ = fVar188 * auVar260._4_4_;
  fVar189 = auVar238._8_4_;
  auVar224._8_4_ = fVar189 * auVar260._8_4_;
  fVar190 = auVar238._12_4_;
  auVar224._12_4_ = fVar190 * auVar260._12_4_;
  auVar241._0_4_ = auVar327._0_4_ * auVar81._0_4_;
  auVar241._4_4_ = auVar327._4_4_ * auVar81._4_4_;
  auVar241._8_4_ = auVar327._8_4_ * auVar81._8_4_;
  auVar241._12_4_ = auVar327._12_4_ * auVar81._12_4_;
  auVar260 = vsubps_avx(auVar241,auVar224);
  auVar151 = vshufps_avx(auVar260,auVar260,0xc9);
  auVar260 = vshufps_avx(auVar122,auVar122,0xc9);
  auVar225._0_4_ = fVar171 * auVar260._0_4_;
  auVar225._4_4_ = fVar188 * auVar260._4_4_;
  auVar225._8_4_ = fVar189 * auVar260._8_4_;
  auVar225._12_4_ = fVar190 * auVar260._12_4_;
  auVar160._0_4_ = auVar122._0_4_ * auVar81._0_4_;
  auVar160._4_4_ = auVar122._4_4_ * auVar81._4_4_;
  auVar160._8_4_ = auVar122._8_4_ * auVar81._8_4_;
  auVar160._12_4_ = auVar122._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar160,auVar225);
  auVar122 = vshufps_avx(auVar81,auVar81,0xc9);
  auVar81 = vshufps_avx(auVar172,auVar172,0xc9);
  auVar260 = vshufps_avx(auVar257,auVar257,0xc9);
  auVar161._0_4_ = auVar172._0_4_ * auVar260._0_4_;
  auVar161._4_4_ = auVar172._4_4_ * auVar260._4_4_;
  auVar161._8_4_ = auVar172._8_4_ * auVar260._8_4_;
  auVar161._12_4_ = auVar172._12_4_ * auVar260._12_4_;
  auVar258._0_4_ = auVar257._0_4_ * auVar81._0_4_;
  auVar258._4_4_ = auVar257._4_4_ * auVar81._4_4_;
  auVar258._8_4_ = auVar257._8_4_ * auVar81._8_4_;
  auVar258._12_4_ = auVar257._12_4_ * auVar81._12_4_;
  auVar260 = vsubps_avx(auVar258,auVar161);
  auVar111 = vshufps_avx(auVar260,auVar260,0xc9);
  auVar260 = vshufps_avx(auVar198,auVar198,0xc9);
  auVar259._0_4_ = auVar260._0_4_ * auVar172._0_4_;
  auVar259._4_4_ = auVar260._4_4_ * auVar172._4_4_;
  auVar259._8_4_ = auVar260._8_4_ * auVar172._8_4_;
  auVar259._12_4_ = auVar260._12_4_ * auVar172._12_4_;
  auVar199._0_4_ = auVar81._0_4_ * auVar198._0_4_;
  auVar199._4_4_ = auVar81._4_4_ * auVar198._4_4_;
  auVar199._8_4_ = auVar81._8_4_ * auVar198._8_4_;
  auVar199._12_4_ = auVar81._12_4_ * auVar198._12_4_;
  auVar260 = vsubps_avx(auVar199,auVar259);
  auVar81 = vdpps_avx(auVar151,auVar151,0x7f);
  auVar141 = vshufps_avx(auVar260,auVar260,0xc9);
  fVar216 = auVar81._0_4_;
  auVar261 = ZEXT416((uint)fVar216);
  auVar260 = vrsqrtss_avx(auVar261,auVar261);
  fVar194 = auVar260._0_4_;
  auVar260 = vdpps_avx(auVar151,auVar122,0x7f);
  auVar112 = ZEXT416((uint)(fVar194 * 1.5 - fVar216 * 0.5 * fVar194 * fVar194 * fVar194));
  auVar112 = vshufps_avx(auVar112,auVar112,0);
  fVar194 = auVar112._0_4_ * auVar151._0_4_;
  fVar221 = auVar112._4_4_ * auVar151._4_4_;
  fVar215 = auVar112._8_4_ * auVar151._8_4_;
  fVar234 = auVar112._12_4_ * auVar151._12_4_;
  auVar81 = vshufps_avx(auVar81,auVar81,0);
  auVar274._0_4_ = auVar122._0_4_ * auVar81._0_4_;
  auVar274._4_4_ = auVar122._4_4_ * auVar81._4_4_;
  auVar274._8_4_ = auVar122._8_4_ * auVar81._8_4_;
  auVar274._12_4_ = auVar122._12_4_ * auVar81._12_4_;
  auVar81 = vshufps_avx(auVar260,auVar260,0);
  auVar242._0_4_ = auVar81._0_4_ * auVar151._0_4_;
  auVar242._4_4_ = auVar81._4_4_ * auVar151._4_4_;
  auVar242._8_4_ = auVar81._8_4_ * auVar151._8_4_;
  auVar242._12_4_ = auVar81._12_4_ * auVar151._12_4_;
  auVar5 = vsubps_avx(auVar274,auVar242);
  auVar260 = vrcpss_avx(auVar261,auVar261);
  auVar81 = vdpps_avx(auVar111,auVar111,0x7f);
  auVar260 = ZEXT416((uint)(auVar260._0_4_ * (2.0 - fVar216 * auVar260._0_4_)));
  auVar151 = vshufps_avx(auVar260,auVar260,0);
  fVar216 = auVar81._0_4_;
  auVar261 = ZEXT416((uint)fVar216);
  auVar260 = vrsqrtss_avx(auVar261,auVar261);
  fVar235 = auVar260._0_4_;
  auVar260 = ZEXT416((uint)(fVar235 * 1.5 - fVar216 * 0.5 * fVar235 * fVar235 * fVar235));
  auVar122 = vshufps_avx(auVar260,auVar260,0);
  auVar260 = vdpps_avx(auVar111,auVar141,0x7f);
  fVar235 = auVar122._0_4_ * auVar111._0_4_;
  fVar217 = auVar122._4_4_ * auVar111._4_4_;
  fVar236 = auVar122._8_4_ * auVar111._8_4_;
  fVar218 = auVar122._12_4_ * auVar111._12_4_;
  auVar81 = vshufps_avx(auVar81,auVar81,0);
  auVar226._0_4_ = auVar81._0_4_ * auVar141._0_4_;
  auVar226._4_4_ = auVar81._4_4_ * auVar141._4_4_;
  auVar226._8_4_ = auVar81._8_4_ * auVar141._8_4_;
  auVar226._12_4_ = auVar81._12_4_ * auVar141._12_4_;
  auVar81 = vshufps_avx(auVar260,auVar260,0);
  auVar162._0_4_ = auVar81._0_4_ * auVar111._0_4_;
  auVar162._4_4_ = auVar81._4_4_ * auVar111._4_4_;
  auVar162._8_4_ = auVar81._8_4_ * auVar111._8_4_;
  auVar162._12_4_ = auVar81._12_4_ * auVar111._12_4_;
  auVar141 = vsubps_avx(auVar226,auVar162);
  auVar81 = vrcpss_avx(auVar261,auVar261);
  auVar81 = ZEXT416((uint)((2.0 - fVar216 * auVar81._0_4_) * auVar81._0_4_));
  auVar81 = vshufps_avx(auVar81,auVar81,0);
  auVar260 = vshufps_avx(_local_4c8,_local_4c8,0xff);
  auVar262._0_4_ = auVar260._0_4_ * fVar194;
  auVar262._4_4_ = auVar260._4_4_ * fVar221;
  auVar262._8_4_ = auVar260._8_4_ * fVar215;
  auVar262._12_4_ = auVar260._12_4_ * fVar234;
  _local_3c8 = vsubps_avx(_local_4c8,auVar262);
  auVar111 = vshufps_avx(auVar238,auVar238,0xff);
  auVar200._0_4_ =
       auVar111._0_4_ * fVar194 + auVar260._0_4_ * auVar112._0_4_ * auVar151._0_4_ * auVar5._0_4_;
  auVar200._4_4_ =
       auVar111._4_4_ * fVar221 + auVar260._4_4_ * auVar112._4_4_ * auVar151._4_4_ * auVar5._4_4_;
  auVar200._8_4_ =
       auVar111._8_4_ * fVar215 + auVar260._8_4_ * auVar112._8_4_ * auVar151._8_4_ * auVar5._8_4_;
  auVar200._12_4_ =
       auVar111._12_4_ * fVar234 +
       auVar260._12_4_ * auVar112._12_4_ * auVar151._12_4_ * auVar5._12_4_;
  auVar111 = vsubps_avx(auVar238,auVar200);
  local_3d8._0_4_ = auVar262._0_4_ + (float)local_4c8._0_4_;
  local_3d8._4_4_ = auVar262._4_4_ + (float)local_4c8._4_4_;
  fStack_3d0 = auVar262._8_4_ + fStack_4c0;
  fStack_3cc = auVar262._12_4_ + fStack_4bc;
  auVar260 = vshufps_avx(auVar107,auVar107,0xff);
  auVar136._0_4_ = fVar235 * auVar260._0_4_;
  auVar136._4_4_ = fVar217 * auVar260._4_4_;
  auVar136._8_4_ = fVar236 * auVar260._8_4_;
  auVar136._12_4_ = fVar218 * auVar260._12_4_;
  _local_3e8 = vsubps_avx(auVar107,auVar136);
  auVar151 = vshufps_avx(auVar172,auVar172,0xff);
  auVar75._0_4_ =
       fVar235 * auVar151._0_4_ + auVar260._0_4_ * auVar122._0_4_ * auVar141._0_4_ * auVar81._0_4_;
  auVar75._4_4_ =
       fVar217 * auVar151._4_4_ + auVar260._4_4_ * auVar122._4_4_ * auVar141._4_4_ * auVar81._4_4_;
  auVar75._8_4_ =
       fVar236 * auVar151._8_4_ + auVar260._8_4_ * auVar122._8_4_ * auVar141._8_4_ * auVar81._8_4_;
  auVar75._12_4_ =
       fVar218 * auVar151._12_4_ +
       auVar260._12_4_ * auVar122._12_4_ * auVar141._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar172,auVar75);
  local_4a8 = auVar107._0_4_ + auVar136._0_4_;
  fStack_4a4 = auVar107._4_4_ + auVar136._4_4_;
  fStack_4a0 = auVar107._8_4_ + auVar136._8_4_;
  fStack_49c = auVar107._12_4_ + auVar136._12_4_;
  local_3f8._0_4_ = local_3c8._0_4_ + auVar111._0_4_ * 0.33333334;
  local_3f8._4_4_ = local_3c8._4_4_ + auVar111._4_4_ * 0.33333334;
  fStack_3f0 = local_3c8._8_4_ + auVar111._8_4_ * 0.33333334;
  fStack_3ec = local_3c8._12_4_ + auVar111._12_4_ * 0.33333334;
  auVar76._0_4_ = auVar81._0_4_ * 0.33333334;
  auVar76._4_4_ = auVar81._4_4_ * 0.33333334;
  auVar76._8_4_ = auVar81._8_4_ * 0.33333334;
  auVar76._12_4_ = auVar81._12_4_ * 0.33333334;
  _local_408 = vsubps_avx(_local_3e8,auVar76);
  aVar4 = (ray->org).field_0;
  auVar151 = vsubps_avx(_local_3c8,(undefined1  [16])aVar4);
  auVar260 = vmovsldup_avx(auVar151);
  auVar81 = vmovshdup_avx(auVar151);
  auVar151 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar194 = (pre->ray_space).vx.field_0.m128[0];
  fVar221 = (pre->ray_space).vx.field_0.m128[1];
  fVar215 = (pre->ray_space).vx.field_0.m128[2];
  fVar234 = (pre->ray_space).vx.field_0.m128[3];
  fVar216 = (pre->ray_space).vy.field_0.m128[0];
  fVar235 = (pre->ray_space).vy.field_0.m128[1];
  fVar217 = (pre->ray_space).vy.field_0.m128[2];
  fVar236 = (pre->ray_space).vy.field_0.m128[3];
  fVar218 = (pre->ray_space).vz.field_0.m128[0];
  fVar237 = (pre->ray_space).vz.field_0.m128[1];
  fVar219 = (pre->ray_space).vz.field_0.m128[2];
  fVar239 = (pre->ray_space).vz.field_0.m128[3];
  fVar220 = fVar194 * auVar260._0_4_ + fVar216 * auVar81._0_4_ + fVar218 * auVar151._0_4_;
  fVar240 = fVar221 * auVar260._4_4_ + fVar235 * auVar81._4_4_ + fVar237 * auVar151._4_4_;
  local_4c8._4_4_ = fVar240;
  local_4c8._0_4_ = fVar220;
  fStack_4c0 = fVar215 * auVar260._8_4_ + fVar217 * auVar81._8_4_ + fVar219 * auVar151._8_4_;
  fStack_4bc = fVar234 * auVar260._12_4_ + fVar236 * auVar81._12_4_ + fVar239 * auVar151._12_4_;
  auVar151 = vsubps_avx(_local_3f8,(undefined1  [16])aVar4);
  auVar260 = vmovsldup_avx(auVar151);
  auVar81 = vmovshdup_avx(auVar151);
  auVar151 = vshufps_avx(auVar151,auVar151,0xaa);
  auVar108._0_8_ =
       CONCAT44(fVar221 * auVar260._4_4_ + auVar81._4_4_ * fVar235 + fVar237 * auVar151._4_4_,
                fVar194 * auVar260._0_4_ + auVar81._0_4_ * fVar216 + fVar218 * auVar151._0_4_);
  auVar108._8_4_ = fVar215 * auVar260._8_4_ + auVar81._8_4_ * fVar217 + fVar219 * auVar151._8_4_;
  auVar108._12_4_ = fVar234 * auVar260._12_4_ + auVar81._12_4_ * fVar236 + fVar239 * auVar151._12_4_
  ;
  auVar260 = vsubps_avx(_local_408,(undefined1  [16])aVar4);
  auVar151 = vshufps_avx(auVar260,auVar260,0xaa);
  auVar81 = vmovshdup_avx(auVar260);
  auVar260 = vmovsldup_avx(auVar260);
  auVar328._0_4_ = auVar81._0_4_ * fVar216 + auVar151._0_4_ * fVar218 + fVar194 * auVar260._0_4_;
  auVar328._4_4_ = auVar81._4_4_ * fVar235 + auVar151._4_4_ * fVar237 + fVar221 * auVar260._4_4_;
  auVar328._8_4_ = auVar81._8_4_ * fVar217 + auVar151._8_4_ * fVar219 + fVar215 * auVar260._8_4_;
  auVar328._12_4_ = auVar81._12_4_ * fVar236 + auVar151._12_4_ * fVar239 + fVar234 * auVar260._12_4_
  ;
  auVar260 = vsubps_avx(_local_3e8,(undefined1  [16])aVar4);
  auVar151 = vshufps_avx(auVar260,auVar260,0xaa);
  auVar81 = vmovshdup_avx(auVar260);
  auVar260 = vmovsldup_avx(auVar260);
  auVar320._0_8_ =
       CONCAT44(auVar260._4_4_ * fVar221 + auVar81._4_4_ * fVar235 + auVar151._4_4_ * fVar237,
                auVar260._0_4_ * fVar194 + auVar81._0_4_ * fVar216 + auVar151._0_4_ * fVar218);
  auVar320._8_4_ = auVar260._8_4_ * fVar215 + auVar81._8_4_ * fVar217 + auVar151._8_4_ * fVar219;
  auVar320._12_4_ = auVar260._12_4_ * fVar234 + auVar81._12_4_ * fVar236 + auVar151._12_4_ * fVar239
  ;
  auVar260 = vsubps_avx(_local_3d8,(undefined1  [16])aVar4);
  auVar151 = vshufps_avx(auVar260,auVar260,0xaa);
  auVar81 = vmovshdup_avx(auVar260);
  auVar260 = vmovsldup_avx(auVar260);
  auVar288._0_8_ =
       CONCAT44(auVar260._4_4_ * fVar221 + auVar81._4_4_ * fVar235 + auVar151._4_4_ * fVar237,
                auVar260._0_4_ * fVar194 + auVar81._0_4_ * fVar216 + auVar151._0_4_ * fVar218);
  auVar288._8_4_ = auVar260._8_4_ * fVar215 + auVar81._8_4_ * fVar217 + auVar151._8_4_ * fVar219;
  auVar288._12_4_ = auVar260._12_4_ * fVar234 + auVar81._12_4_ * fVar236 + auVar151._12_4_ * fVar239
  ;
  local_418._0_4_ = (fVar171 + auVar200._0_4_) * 0.33333334 + (float)local_3d8._0_4_;
  local_418._4_4_ = (fVar188 + auVar200._4_4_) * 0.33333334 + (float)local_3d8._4_4_;
  fStack_410 = (fVar189 + auVar200._8_4_) * 0.33333334 + fStack_3d0;
  fStack_40c = (fVar190 + auVar200._12_4_) * 0.33333334 + fStack_3cc;
  auVar260 = vsubps_avx(_local_418,(undefined1  [16])aVar4);
  auVar151 = vshufps_avx(auVar260,auVar260,0xaa);
  auVar81 = vmovshdup_avx(auVar260);
  auVar260 = vmovsldup_avx(auVar260);
  auVar275._0_8_ =
       CONCAT44(auVar260._4_4_ * fVar221 + auVar81._4_4_ * fVar235 + auVar151._4_4_ * fVar237,
                auVar260._0_4_ * fVar194 + auVar81._0_4_ * fVar216 + auVar151._0_4_ * fVar218);
  auVar275._8_4_ = auVar260._8_4_ * fVar215 + auVar81._8_4_ * fVar217 + auVar151._8_4_ * fVar219;
  auVar275._12_4_ = auVar260._12_4_ * fVar234 + auVar81._12_4_ * fVar236 + auVar151._12_4_ * fVar239
  ;
  auVar243._0_4_ = (auVar172._0_4_ + auVar75._0_4_) * 0.33333334;
  auVar243._4_4_ = (auVar172._4_4_ + auVar75._4_4_) * 0.33333334;
  auVar243._8_4_ = (auVar172._8_4_ + auVar75._8_4_) * 0.33333334;
  auVar243._12_4_ = (auVar172._12_4_ + auVar75._12_4_) * 0.33333334;
  auVar61._4_4_ = fStack_4a4;
  auVar61._0_4_ = local_4a8;
  auVar61._8_4_ = fStack_4a0;
  auVar61._12_4_ = fStack_49c;
  _local_2d8 = vsubps_avx(auVar61,auVar243);
  auVar260 = vsubps_avx(_local_2d8,(undefined1  [16])aVar4);
  auVar151 = vshufps_avx(auVar260,auVar260,0xaa);
  auVar81 = vmovshdup_avx(auVar260);
  auVar260 = vmovsldup_avx(auVar260);
  auVar263._0_8_ =
       CONCAT44(auVar81._4_4_ * fVar235 + auVar151._4_4_ * fVar237 + fVar221 * auVar260._4_4_,
                auVar81._0_4_ * fVar216 + auVar151._0_4_ * fVar218 + fVar194 * auVar260._0_4_);
  auVar263._8_4_ = auVar81._8_4_ * fVar217 + auVar151._8_4_ * fVar219 + fVar215 * auVar260._8_4_;
  auVar263._12_4_ = auVar81._12_4_ * fVar236 + auVar151._12_4_ * fVar239 + fVar234 * auVar260._12_4_
  ;
  auVar260 = vsubps_avx(auVar61,(undefined1  [16])aVar4);
  auVar151 = vshufps_avx(auVar260,auVar260,0xaa);
  auVar81 = vmovshdup_avx(auVar260);
  auVar260 = vmovsldup_avx(auVar260);
  auVar244._0_8_ =
       CONCAT44(fVar221 * auVar260._4_4_ + auVar81._4_4_ * fVar235 + auVar151._4_4_ * fVar237,
                fVar194 * auVar260._0_4_ + auVar81._0_4_ * fVar216 + auVar151._0_4_ * fVar218);
  auVar244._8_4_ = fVar215 * auVar260._8_4_ + auVar81._8_4_ * fVar217 + auVar151._8_4_ * fVar219;
  auVar244._12_4_ = fVar234 * auVar260._12_4_ + auVar81._12_4_ * fVar236 + auVar151._12_4_ * fVar239
  ;
  _local_468 = vmovlhps_avx(_local_4c8,auVar288);
  _local_328 = vmovlhps_avx(auVar108,auVar275);
  _local_338 = vmovlhps_avx(auVar328,auVar263);
  _local_2c8 = vmovlhps_avx(auVar320,auVar244);
  auVar81 = vminps_avx(_local_468,_local_328);
  auVar260 = vminps_avx(_local_338,_local_2c8);
  auVar151 = vminps_avx(auVar81,auVar260);
  auVar81 = vmaxps_avx(_local_468,_local_328);
  auVar260 = vmaxps_avx(_local_338,_local_2c8);
  auVar81 = vmaxps_avx(auVar81,auVar260);
  auVar260 = vshufpd_avx(auVar151,auVar151,3);
  auVar151 = vminps_avx(auVar151,auVar260);
  auVar260 = vshufpd_avx(auVar81,auVar81,3);
  auVar260 = vmaxps_avx(auVar81,auVar260);
  auVar227._8_4_ = 0x7fffffff;
  auVar227._0_8_ = 0x7fffffff7fffffff;
  auVar227._12_4_ = 0x7fffffff;
  auVar81 = vandps_avx(auVar151,auVar227);
  auVar260 = vandps_avx(auVar260,auVar227);
  auVar81 = vmaxps_avx(auVar81,auVar260);
  auVar260 = vmovshdup_avx(auVar81);
  auVar81 = vmaxss_avx(auVar260,auVar81);
  fVar194 = auVar81._0_4_ * 9.536743e-07;
  local_498 = local_4c8;
  local_378._8_8_ = auVar108._0_8_;
  local_378._0_8_ = auVar108._0_8_;
  local_388._8_8_ = auVar320._0_8_;
  local_388._0_8_ = auVar320._0_8_;
  register0x00001488 = auVar288._0_8_;
  local_368 = auVar288._0_8_;
  local_398._8_8_ = auVar275._0_8_;
  local_398._0_8_ = auVar275._0_8_;
  auVar284 = ZEXT1664(local_398);
  local_3a8._8_8_ = auVar263._0_8_;
  local_3a8._0_8_ = auVar263._0_8_;
  local_3b8._8_8_ = auVar244._0_8_;
  local_3b8._0_8_ = auVar244._0_8_;
  _local_4c8 = ZEXT416((uint)fVar194);
  auVar81 = vshufps_avx(_local_4c8,ZEXT416((uint)fVar194),0);
  local_1d8._16_16_ = auVar81;
  local_1d8._0_16_ = auVar81;
  auVar77._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
  auVar77._8_4_ = auVar81._8_4_ ^ 0x80000000;
  auVar77._12_4_ = auVar81._12_4_ ^ 0x80000000;
  local_78._16_16_ = auVar77;
  local_78._0_16_ = auVar77;
  bVar67 = false;
  uVar65 = 0;
  _local_1e8 = vsubps_avx(_local_328,_local_468);
  _local_1f8 = vsubps_avx(_local_338,_local_328);
  _local_208 = vsubps_avx(_local_2c8,_local_338);
  auVar158 = ZEXT1664(_local_368);
  _local_228 = vsubps_avx(_local_3d8,_local_3c8);
  _local_238 = vsubps_avx(_local_418,_local_3f8);
  _local_248 = vsubps_avx(_local_2d8,_local_408);
  auVar307 = ZEXT1664(local_3b8);
  auVar303 = ZEXT1664(local_3a8);
  auVar269 = ZEXT1664(local_388);
  auVar255 = ZEXT1664(local_378);
  auVar62._4_4_ = fStack_4a4;
  auVar62._0_4_ = local_4a8;
  auVar62._8_4_ = fStack_4a0;
  auVar62._12_4_ = fStack_49c;
  _local_258 = vsubps_avx(auVar62,_local_3e8);
  auVar214 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar318 = ZEXT1664(ZEXT816(0x3f80000000000000));
  fVar194 = fVar220;
  fVar221 = fVar240;
  uStack_490 = local_498;
LAB_01092831:
  do {
    local_218 = auVar318._0_16_;
    auVar201 = auVar214._0_16_;
    auVar81 = vshufps_avx(auVar201,auVar201,0x50);
    auVar321._8_4_ = 0x3f800000;
    auVar321._0_8_ = 0x3f8000003f800000;
    auVar321._12_4_ = 0x3f800000;
    auVar325._16_4_ = 0x3f800000;
    auVar325._0_16_ = auVar321;
    auVar325._20_4_ = 0x3f800000;
    auVar325._24_4_ = 0x3f800000;
    auVar325._28_4_ = 0x3f800000;
    auVar260 = vsubps_avx(auVar321,auVar81);
    fVar215 = auVar81._0_4_;
    fVar234 = auVar81._4_4_;
    fVar216 = auVar81._8_4_;
    fVar235 = auVar81._12_4_;
    fVar217 = auVar260._0_4_;
    fVar236 = auVar260._4_4_;
    fVar218 = auVar260._8_4_;
    fVar237 = auVar260._12_4_;
    auVar163._0_4_ = auVar158._0_4_ * fVar215 + fVar217 * fVar220;
    auVar163._4_4_ = auVar158._4_4_ * fVar234 + fVar236 * fVar240;
    auVar163._8_4_ = auVar158._8_4_ * fVar216 + fVar218 * fVar194;
    auVar163._12_4_ = auVar158._12_4_ * fVar235 + fVar237 * fVar221;
    auVar137._0_4_ = auVar284._0_4_ * fVar215 + fVar217 * auVar255._0_4_;
    auVar137._4_4_ = auVar284._4_4_ * fVar234 + fVar236 * auVar255._4_4_;
    auVar137._8_4_ = auVar284._8_4_ * fVar216 + fVar218 * auVar255._8_4_;
    auVar137._12_4_ = auVar284._12_4_ * fVar235 + fVar237 * auVar255._12_4_;
    auVar245._0_4_ = auVar303._0_4_ * fVar215 + auVar328._0_4_ * fVar217;
    auVar245._4_4_ = auVar303._4_4_ * fVar234 + auVar328._4_4_ * fVar236;
    auVar245._8_4_ = auVar303._8_4_ * fVar216 + auVar328._0_4_ * fVar218;
    auVar245._12_4_ = auVar303._12_4_ * fVar235 + auVar328._4_4_ * fVar237;
    auVar173._0_4_ = auVar307._0_4_ * fVar215 + auVar269._0_4_ * fVar217;
    auVar173._4_4_ = auVar307._4_4_ * fVar234 + auVar269._4_4_ * fVar236;
    auVar173._8_4_ = auVar307._8_4_ * fVar216 + auVar269._8_4_ * fVar218;
    auVar173._12_4_ = auVar307._12_4_ * fVar235 + auVar269._12_4_ * fVar237;
    auVar81 = vmovshdup_avx(local_218);
    auVar260 = vshufps_avx(local_218,local_218,0);
    auVar282._16_16_ = auVar260;
    auVar282._0_16_ = auVar260;
    auVar151 = vshufps_avx(local_218,local_218,0x55);
    auVar96._16_16_ = auVar151;
    auVar96._0_16_ = auVar151;
    auVar92 = vsubps_avx(auVar96,auVar282);
    auVar151 = vshufps_avx(auVar163,auVar163,0);
    auVar122 = vshufps_avx(auVar163,auVar163,0x55);
    auVar111 = vshufps_avx(auVar137,auVar137,0);
    auVar141 = vshufps_avx(auVar137,auVar137,0x55);
    auVar112 = vshufps_avx(auVar245,auVar245,0);
    auVar238 = vshufps_avx(auVar245,auVar245,0x55);
    auVar5 = vshufps_avx(auVar173,auVar173,0);
    auVar261 = vshufps_avx(auVar173,auVar173,0x55);
    auVar81 = ZEXT416((uint)((auVar81._0_4_ - auVar318._0_4_) * 0.04761905));
    auVar81 = vshufps_avx(auVar81,auVar81,0);
    auVar293._0_4_ = auVar260._0_4_ + auVar92._0_4_ * 0.0;
    auVar293._4_4_ = auVar260._4_4_ + auVar92._4_4_ * 0.14285715;
    auVar293._8_4_ = auVar260._8_4_ + auVar92._8_4_ * 0.2857143;
    auVar293._12_4_ = auVar260._12_4_ + auVar92._12_4_ * 0.42857146;
    auVar293._16_4_ = auVar260._0_4_ + auVar92._16_4_ * 0.5714286;
    auVar293._20_4_ = auVar260._4_4_ + auVar92._20_4_ * 0.71428573;
    auVar293._24_4_ = auVar260._8_4_ + auVar92._24_4_ * 0.8571429;
    auVar293._28_4_ = auVar260._12_4_ + auVar92._28_4_;
    auVar14 = vsubps_avx(auVar325,auVar293);
    fVar194 = auVar111._0_4_;
    fVar215 = auVar111._4_4_;
    fVar216 = auVar111._8_4_;
    fVar217 = auVar111._12_4_;
    fVar72 = auVar14._0_4_;
    fVar102 = auVar14._4_4_;
    fVar103 = auVar14._8_4_;
    fVar104 = auVar14._12_4_;
    fVar285 = auVar14._16_4_;
    fVar286 = auVar14._20_4_;
    fVar287 = auVar14._24_4_;
    fVar193 = auVar141._0_4_;
    fVar270 = auVar141._4_4_;
    fVar271 = auVar141._8_4_;
    fVar272 = auVar141._12_4_;
    fVar319 = auVar122._12_4_ + 1.0;
    fVar189 = auVar112._0_4_;
    fVar190 = auVar112._4_4_;
    fVar191 = auVar112._8_4_;
    fVar192 = auVar112._12_4_;
    fVar218 = fVar189 * auVar293._0_4_ + fVar72 * fVar194;
    fVar237 = fVar190 * auVar293._4_4_ + fVar102 * fVar215;
    fVar219 = fVar191 * auVar293._8_4_ + fVar103 * fVar216;
    fVar239 = fVar192 * auVar293._12_4_ + fVar104 * fVar217;
    fVar220 = fVar189 * auVar293._16_4_ + fVar285 * fVar194;
    fVar240 = fVar190 * auVar293._20_4_ + fVar286 * fVar215;
    fVar171 = fVar191 * auVar293._24_4_ + fVar287 * fVar216;
    fVar221 = auVar238._0_4_;
    fVar234 = auVar238._4_4_;
    fVar235 = auVar238._8_4_;
    fVar236 = auVar238._12_4_;
    fVar304 = fVar193 * fVar72 + auVar293._0_4_ * fVar221;
    fVar308 = fVar270 * fVar102 + auVar293._4_4_ * fVar234;
    fVar309 = fVar271 * fVar103 + auVar293._8_4_ * fVar235;
    fVar310 = fVar272 * fVar104 + auVar293._12_4_ * fVar236;
    fVar311 = fVar193 * fVar285 + auVar293._16_4_ * fVar221;
    fVar312 = fVar270 * fVar286 + auVar293._20_4_ * fVar234;
    fVar313 = fVar271 * fVar287 + auVar293._24_4_ * fVar235;
    fVar314 = fVar272 + fVar217;
    auVar260 = vshufps_avx(auVar163,auVar163,0xaa);
    auVar111 = vshufps_avx(auVar163,auVar163,0xff);
    fVar188 = fVar192 + 0.0;
    auVar141 = vshufps_avx(auVar137,auVar137,0xaa);
    auVar112 = vshufps_avx(auVar137,auVar137,0xff);
    auVar186._0_4_ =
         fVar72 * (auVar293._0_4_ * fVar194 + fVar72 * auVar151._0_4_) + auVar293._0_4_ * fVar218;
    auVar186._4_4_ =
         fVar102 * (auVar293._4_4_ * fVar215 + fVar102 * auVar151._4_4_) + auVar293._4_4_ * fVar237;
    auVar186._8_4_ =
         fVar103 * (auVar293._8_4_ * fVar216 + fVar103 * auVar151._8_4_) + auVar293._8_4_ * fVar219;
    auVar186._12_4_ =
         fVar104 * (auVar293._12_4_ * fVar217 + fVar104 * auVar151._12_4_) +
         auVar293._12_4_ * fVar239;
    auVar186._16_4_ =
         fVar285 * (auVar293._16_4_ * fVar194 + fVar285 * auVar151._0_4_) +
         auVar293._16_4_ * fVar220;
    auVar186._20_4_ =
         fVar286 * (auVar293._20_4_ * fVar215 + fVar286 * auVar151._4_4_) +
         auVar293._20_4_ * fVar240;
    auVar186._24_4_ =
         fVar287 * (auVar293._24_4_ * fVar216 + fVar287 * auVar151._8_4_) +
         auVar293._24_4_ * fVar171;
    auVar186._28_4_ = auVar151._12_4_ + 1.0 + fVar236;
    auVar212._0_4_ =
         fVar72 * (fVar193 * auVar293._0_4_ + auVar122._0_4_ * fVar72) + auVar293._0_4_ * fVar304;
    auVar212._4_4_ =
         fVar102 * (fVar270 * auVar293._4_4_ + auVar122._4_4_ * fVar102) + auVar293._4_4_ * fVar308;
    auVar212._8_4_ =
         fVar103 * (fVar271 * auVar293._8_4_ + auVar122._8_4_ * fVar103) + auVar293._8_4_ * fVar309;
    auVar212._12_4_ =
         fVar104 * (fVar272 * auVar293._12_4_ + auVar122._12_4_ * fVar104) +
         auVar293._12_4_ * fVar310;
    auVar212._16_4_ =
         fVar285 * (fVar193 * auVar293._16_4_ + auVar122._0_4_ * fVar285) +
         auVar293._16_4_ * fVar311;
    auVar212._20_4_ =
         fVar286 * (fVar270 * auVar293._20_4_ + auVar122._4_4_ * fVar286) +
         auVar293._20_4_ * fVar312;
    auVar212._24_4_ =
         fVar287 * (fVar271 * auVar293._24_4_ + auVar122._8_4_ * fVar287) +
         auVar293._24_4_ * fVar313;
    auVar212._28_4_ = auVar261._12_4_ + fVar236;
    auVar97._0_4_ =
         fVar72 * fVar218 + auVar293._0_4_ * (fVar189 * fVar72 + auVar5._0_4_ * auVar293._0_4_);
    auVar97._4_4_ =
         fVar102 * fVar237 + auVar293._4_4_ * (fVar190 * fVar102 + auVar5._4_4_ * auVar293._4_4_);
    auVar97._8_4_ =
         fVar103 * fVar219 + auVar293._8_4_ * (fVar191 * fVar103 + auVar5._8_4_ * auVar293._8_4_);
    auVar97._12_4_ =
         fVar104 * fVar239 + auVar293._12_4_ * (fVar192 * fVar104 + auVar5._12_4_ * auVar293._12_4_)
    ;
    auVar97._16_4_ =
         fVar285 * fVar220 + auVar293._16_4_ * (fVar189 * fVar285 + auVar5._0_4_ * auVar293._16_4_);
    auVar97._20_4_ =
         fVar286 * fVar240 + auVar293._20_4_ * (fVar190 * fVar286 + auVar5._4_4_ * auVar293._20_4_);
    auVar97._24_4_ =
         fVar287 * fVar171 + auVar293._24_4_ * (fVar191 * fVar287 + auVar5._8_4_ * auVar293._24_4_);
    auVar97._28_4_ = fVar217 + 1.0 + fVar188;
    auVar302._0_4_ =
         fVar72 * fVar304 + auVar293._0_4_ * (auVar261._0_4_ * auVar293._0_4_ + fVar72 * fVar221);
    auVar302._4_4_ =
         fVar102 * fVar308 + auVar293._4_4_ * (auVar261._4_4_ * auVar293._4_4_ + fVar102 * fVar234);
    auVar302._8_4_ =
         fVar103 * fVar309 + auVar293._8_4_ * (auVar261._8_4_ * auVar293._8_4_ + fVar103 * fVar235);
    auVar302._12_4_ =
         fVar104 * fVar310 +
         auVar293._12_4_ * (auVar261._12_4_ * auVar293._12_4_ + fVar104 * fVar236);
    auVar302._16_4_ =
         fVar285 * fVar311 +
         auVar293._16_4_ * (auVar261._0_4_ * auVar293._16_4_ + fVar285 * fVar221);
    auVar302._20_4_ =
         fVar286 * fVar312 +
         auVar293._20_4_ * (auVar261._4_4_ * auVar293._20_4_ + fVar286 * fVar234);
    auVar302._24_4_ =
         fVar287 * fVar313 +
         auVar293._24_4_ * (auVar261._8_4_ * auVar293._24_4_ + fVar287 * fVar235);
    auVar302._28_4_ = fVar188 + fVar236 + 0.0;
    local_b8._0_4_ = fVar72 * auVar186._0_4_ + auVar293._0_4_ * auVar97._0_4_;
    local_b8._4_4_ = fVar102 * auVar186._4_4_ + auVar293._4_4_ * auVar97._4_4_;
    local_b8._8_4_ = fVar103 * auVar186._8_4_ + auVar293._8_4_ * auVar97._8_4_;
    local_b8._12_4_ = fVar104 * auVar186._12_4_ + auVar293._12_4_ * auVar97._12_4_;
    local_b8._16_4_ = fVar285 * auVar186._16_4_ + auVar293._16_4_ * auVar97._16_4_;
    local_b8._20_4_ = fVar286 * auVar186._20_4_ + auVar293._20_4_ * auVar97._20_4_;
    local_b8._24_4_ = fVar287 * auVar186._24_4_ + auVar293._24_4_ * auVar97._24_4_;
    local_b8._28_4_ = fVar314 + fVar236 + 0.0;
    auVar170._0_4_ = fVar72 * auVar212._0_4_ + auVar293._0_4_ * auVar302._0_4_;
    auVar170._4_4_ = fVar102 * auVar212._4_4_ + auVar293._4_4_ * auVar302._4_4_;
    auVar170._8_4_ = fVar103 * auVar212._8_4_ + auVar293._8_4_ * auVar302._8_4_;
    auVar170._12_4_ = fVar104 * auVar212._12_4_ + auVar293._12_4_ * auVar302._12_4_;
    auVar170._16_4_ = fVar285 * auVar212._16_4_ + auVar293._16_4_ * auVar302._16_4_;
    auVar170._20_4_ = fVar286 * auVar212._20_4_ + auVar293._20_4_ * auVar302._20_4_;
    auVar170._24_4_ = fVar287 * auVar212._24_4_ + auVar293._24_4_ * auVar302._24_4_;
    auVar170._28_4_ = fVar314 + fVar188;
    auVar15 = vsubps_avx(auVar97,auVar186);
    auVar92 = vsubps_avx(auVar302,auVar212);
    local_358._0_4_ = auVar81._0_4_;
    local_358._4_4_ = auVar81._4_4_;
    fStack_350 = auVar81._8_4_;
    fStack_34c = auVar81._12_4_;
    local_f8 = (float)local_358._0_4_ * auVar15._0_4_ * 3.0;
    fStack_f4 = (float)local_358._4_4_ * auVar15._4_4_ * 3.0;
    auVar23._4_4_ = fStack_f4;
    auVar23._0_4_ = local_f8;
    fStack_f0 = fStack_350 * auVar15._8_4_ * 3.0;
    auVar23._8_4_ = fStack_f0;
    fStack_ec = fStack_34c * auVar15._12_4_ * 3.0;
    auVar23._12_4_ = fStack_ec;
    fStack_e8 = (float)local_358._0_4_ * auVar15._16_4_ * 3.0;
    auVar23._16_4_ = fStack_e8;
    fStack_e4 = (float)local_358._4_4_ * auVar15._20_4_ * 3.0;
    auVar23._20_4_ = fStack_e4;
    fStack_e0 = fStack_350 * auVar15._24_4_ * 3.0;
    auVar23._24_4_ = fStack_e0;
    auVar23._28_4_ = auVar15._28_4_;
    local_118 = (float)local_358._0_4_ * auVar92._0_4_ * 3.0;
    fStack_114 = (float)local_358._4_4_ * auVar92._4_4_ * 3.0;
    auVar24._4_4_ = fStack_114;
    auVar24._0_4_ = local_118;
    fStack_110 = fStack_350 * auVar92._8_4_ * 3.0;
    auVar24._8_4_ = fStack_110;
    fStack_10c = fStack_34c * auVar92._12_4_ * 3.0;
    auVar24._12_4_ = fStack_10c;
    fStack_108 = (float)local_358._0_4_ * auVar92._16_4_ * 3.0;
    auVar24._16_4_ = fStack_108;
    fStack_104 = (float)local_358._4_4_ * auVar92._20_4_ * 3.0;
    auVar24._20_4_ = fStack_104;
    fStack_100 = fStack_350 * auVar92._24_4_ * 3.0;
    auVar24._24_4_ = fStack_100;
    auVar24._28_4_ = fVar314;
    auVar13 = vsubps_avx(local_b8,auVar23);
    auVar92 = vperm2f128_avx(auVar13,auVar13,1);
    auVar92 = vshufps_avx(auVar92,auVar13,0x30);
    _local_458 = vshufps_avx(auVar13,auVar92,0x29);
    auVar13 = vsubps_avx(auVar170,auVar24);
    auVar92 = vperm2f128_avx(auVar13,auVar13,1);
    auVar92 = vshufps_avx(auVar92,auVar13,0x30);
    auVar13 = vshufps_avx(auVar13,auVar92,0x29);
    fVar312 = auVar141._0_4_;
    fVar313 = auVar141._4_4_;
    fVar329 = auVar141._8_4_;
    fVar217 = auVar260._12_4_;
    fVar190 = auVar112._0_4_;
    fVar192 = auVar112._4_4_;
    fVar304 = auVar112._8_4_;
    fVar308 = auVar112._12_4_;
    auVar81 = vshufps_avx(auVar245,auVar245,0xaa);
    fVar194 = auVar81._0_4_;
    fVar215 = auVar81._4_4_;
    fVar216 = auVar81._8_4_;
    fVar236 = auVar81._12_4_;
    fVar219 = auVar293._0_4_ * fVar194 + fVar312 * fVar72;
    fVar239 = auVar293._4_4_ * fVar215 + fVar313 * fVar102;
    fVar220 = auVar293._8_4_ * fVar216 + fVar329 * fVar103;
    fVar240 = auVar293._12_4_ * fVar236 + auVar141._12_4_ * fVar104;
    fVar171 = auVar293._16_4_ * fVar194 + fVar312 * fVar285;
    fVar188 = auVar293._20_4_ * fVar215 + fVar313 * fVar286;
    fVar189 = auVar293._24_4_ * fVar216 + fVar329 * fVar287;
    auVar81 = vshufps_avx(auVar245,auVar245,0xff);
    fVar221 = auVar81._0_4_;
    fVar234 = auVar81._4_4_;
    fVar235 = auVar81._8_4_;
    fVar218 = auVar81._12_4_;
    fVar191 = auVar293._0_4_ * fVar221 + fVar190 * fVar72;
    fVar193 = auVar293._4_4_ * fVar234 + fVar192 * fVar102;
    fVar270 = auVar293._8_4_ * fVar235 + fVar304 * fVar103;
    fVar271 = auVar293._12_4_ * fVar218 + fVar308 * fVar104;
    fVar309 = auVar293._16_4_ * fVar221 + fVar190 * fVar285;
    fVar272 = auVar293._20_4_ * fVar234 + fVar192 * fVar286;
    fVar310 = auVar293._24_4_ * fVar235 + fVar304 * fVar287;
    auVar81 = vshufps_avx(auVar173,auVar173,0xaa);
    fVar311 = auVar81._12_4_ + fVar236;
    auVar151 = vshufps_avx(auVar173,auVar173,0xff);
    fVar237 = auVar151._12_4_;
    auVar98._0_4_ =
         fVar72 * (fVar312 * auVar293._0_4_ + fVar72 * auVar260._0_4_) + auVar293._0_4_ * fVar219;
    auVar98._4_4_ =
         fVar102 * (fVar313 * auVar293._4_4_ + fVar102 * auVar260._4_4_) + auVar293._4_4_ * fVar239;
    auVar98._8_4_ =
         fVar103 * (fVar329 * auVar293._8_4_ + fVar103 * auVar260._8_4_) + auVar293._8_4_ * fVar220;
    auVar98._12_4_ =
         fVar104 * (auVar141._12_4_ * auVar293._12_4_ + fVar104 * fVar217) +
         auVar293._12_4_ * fVar240;
    auVar98._16_4_ =
         fVar285 * (fVar312 * auVar293._16_4_ + fVar285 * auVar260._0_4_) +
         auVar293._16_4_ * fVar171;
    auVar98._20_4_ =
         fVar286 * (fVar313 * auVar293._20_4_ + fVar286 * auVar260._4_4_) +
         auVar293._20_4_ * fVar188;
    auVar98._24_4_ =
         fVar287 * (fVar329 * auVar293._24_4_ + fVar287 * auVar260._8_4_) +
         auVar293._24_4_ * fVar189;
    auVar98._28_4_ = auVar13._28_4_ + fVar217 + fVar237;
    auVar131._0_4_ =
         fVar72 * (fVar190 * auVar293._0_4_ + auVar111._0_4_ * fVar72) + auVar293._0_4_ * fVar191;
    auVar131._4_4_ =
         fVar102 * (fVar192 * auVar293._4_4_ + auVar111._4_4_ * fVar102) + auVar293._4_4_ * fVar193;
    auVar131._8_4_ =
         fVar103 * (fVar304 * auVar293._8_4_ + auVar111._8_4_ * fVar103) + auVar293._8_4_ * fVar270;
    auVar131._12_4_ =
         fVar104 * (fVar308 * auVar293._12_4_ + auVar111._12_4_ * fVar104) +
         auVar293._12_4_ * fVar271;
    auVar131._16_4_ =
         fVar285 * (fVar190 * auVar293._16_4_ + auVar111._0_4_ * fVar285) +
         auVar293._16_4_ * fVar309;
    auVar131._20_4_ =
         fVar286 * (fVar192 * auVar293._20_4_ + auVar111._4_4_ * fVar286) +
         auVar293._20_4_ * fVar272;
    auVar131._24_4_ =
         fVar287 * (fVar304 * auVar293._24_4_ + auVar111._8_4_ * fVar287) +
         auVar293._24_4_ * fVar310;
    auVar131._28_4_ = fVar217 + auVar92._28_4_ + fVar237;
    auVar92 = vperm2f128_avx(local_b8,local_b8,1);
    auVar92 = vshufps_avx(auVar92,local_b8,0x30);
    _local_2b8 = vshufps_avx(local_b8,auVar92,0x29);
    auVar213._0_4_ =
         auVar293._0_4_ * (auVar81._0_4_ * auVar293._0_4_ + fVar72 * fVar194) + fVar72 * fVar219;
    auVar213._4_4_ =
         auVar293._4_4_ * (auVar81._4_4_ * auVar293._4_4_ + fVar102 * fVar215) + fVar102 * fVar239;
    auVar213._8_4_ =
         auVar293._8_4_ * (auVar81._8_4_ * auVar293._8_4_ + fVar103 * fVar216) + fVar103 * fVar220;
    auVar213._12_4_ =
         auVar293._12_4_ * (auVar81._12_4_ * auVar293._12_4_ + fVar104 * fVar236) +
         fVar104 * fVar240;
    auVar213._16_4_ =
         auVar293._16_4_ * (auVar81._0_4_ * auVar293._16_4_ + fVar285 * fVar194) + fVar285 * fVar171
    ;
    auVar213._20_4_ =
         auVar293._20_4_ * (auVar81._4_4_ * auVar293._20_4_ + fVar286 * fVar215) + fVar286 * fVar188
    ;
    auVar213._24_4_ =
         auVar293._24_4_ * (auVar81._8_4_ * auVar293._24_4_ + fVar287 * fVar216) + fVar287 * fVar189
    ;
    auVar213._28_4_ = fVar311 + fVar319 + auVar212._28_4_;
    auVar268._0_4_ =
         fVar72 * fVar191 + auVar293._0_4_ * (auVar293._0_4_ * auVar151._0_4_ + fVar72 * fVar221);
    auVar268._4_4_ =
         fVar102 * fVar193 + auVar293._4_4_ * (auVar293._4_4_ * auVar151._4_4_ + fVar102 * fVar234);
    auVar268._8_4_ =
         fVar103 * fVar270 + auVar293._8_4_ * (auVar293._8_4_ * auVar151._8_4_ + fVar103 * fVar235);
    auVar268._12_4_ =
         fVar104 * fVar271 + auVar293._12_4_ * (auVar293._12_4_ * fVar237 + fVar104 * fVar218);
    auVar268._16_4_ =
         fVar285 * fVar309 +
         auVar293._16_4_ * (auVar293._16_4_ * auVar151._0_4_ + fVar285 * fVar221);
    auVar268._20_4_ =
         fVar286 * fVar272 +
         auVar293._20_4_ * (auVar293._20_4_ * auVar151._4_4_ + fVar286 * fVar234);
    auVar268._24_4_ =
         fVar287 * fVar310 +
         auVar293._24_4_ * (auVar293._24_4_ * auVar151._8_4_ + fVar287 * fVar235);
    auVar268._28_4_ = fVar319 + fVar308 + fVar237 + fVar218;
    auVar254._0_4_ = fVar72 * auVar98._0_4_ + auVar293._0_4_ * auVar213._0_4_;
    auVar254._4_4_ = fVar102 * auVar98._4_4_ + auVar293._4_4_ * auVar213._4_4_;
    auVar254._8_4_ = fVar103 * auVar98._8_4_ + auVar293._8_4_ * auVar213._8_4_;
    auVar254._12_4_ = fVar104 * auVar98._12_4_ + auVar293._12_4_ * auVar213._12_4_;
    auVar254._16_4_ = fVar285 * auVar98._16_4_ + auVar293._16_4_ * auVar213._16_4_;
    auVar254._20_4_ = fVar286 * auVar98._20_4_ + auVar293._20_4_ * auVar213._20_4_;
    auVar254._24_4_ = fVar287 * auVar98._24_4_ + auVar293._24_4_ * auVar213._24_4_;
    auVar254._28_4_ = fVar311 + fVar237 + fVar218;
    auVar283._0_4_ = fVar72 * auVar131._0_4_ + auVar293._0_4_ * auVar268._0_4_;
    auVar283._4_4_ = fVar102 * auVar131._4_4_ + auVar293._4_4_ * auVar268._4_4_;
    auVar283._8_4_ = fVar103 * auVar131._8_4_ + auVar293._8_4_ * auVar268._8_4_;
    auVar283._12_4_ = fVar104 * auVar131._12_4_ + auVar293._12_4_ * auVar268._12_4_;
    auVar283._16_4_ = fVar285 * auVar131._16_4_ + auVar293._16_4_ * auVar268._16_4_;
    auVar283._20_4_ = fVar286 * auVar131._20_4_ + auVar293._20_4_ * auVar268._20_4_;
    auVar283._24_4_ = fVar287 * auVar131._24_4_ + auVar293._24_4_ * auVar268._24_4_;
    auVar283._28_4_ = auVar14._28_4_ + auVar293._28_4_;
    auVar14 = vsubps_avx(auVar213,auVar98);
    auVar92 = vsubps_avx(auVar268,auVar131);
    local_138 = (float)local_358._0_4_ * auVar14._0_4_ * 3.0;
    fStack_134 = (float)local_358._4_4_ * auVar14._4_4_ * 3.0;
    auVar25._4_4_ = fStack_134;
    auVar25._0_4_ = local_138;
    fStack_130 = fStack_350 * auVar14._8_4_ * 3.0;
    auVar25._8_4_ = fStack_130;
    fStack_12c = fStack_34c * auVar14._12_4_ * 3.0;
    auVar25._12_4_ = fStack_12c;
    fStack_128 = (float)local_358._0_4_ * auVar14._16_4_ * 3.0;
    auVar25._16_4_ = fStack_128;
    fStack_124 = (float)local_358._4_4_ * auVar14._20_4_ * 3.0;
    auVar25._20_4_ = fStack_124;
    fStack_120 = fStack_350 * auVar14._24_4_ * 3.0;
    auVar25._24_4_ = fStack_120;
    auVar25._28_4_ = auVar14._28_4_;
    local_158 = (float)local_358._0_4_ * auVar92._0_4_ * 3.0;
    fStack_154 = (float)local_358._4_4_ * auVar92._4_4_ * 3.0;
    auVar26._4_4_ = fStack_154;
    auVar26._0_4_ = local_158;
    fStack_150 = fStack_350 * auVar92._8_4_ * 3.0;
    auVar26._8_4_ = fStack_150;
    fStack_14c = fStack_34c * auVar92._12_4_ * 3.0;
    auVar26._12_4_ = fStack_14c;
    fStack_148 = (float)local_358._0_4_ * auVar92._16_4_ * 3.0;
    auVar26._16_4_ = fStack_148;
    fStack_144 = (float)local_358._4_4_ * auVar92._20_4_ * 3.0;
    auVar26._20_4_ = fStack_144;
    fStack_140 = fStack_350 * auVar92._24_4_ * 3.0;
    auVar26._24_4_ = fStack_140;
    auVar26._28_4_ = auVar213._28_4_;
    auVar92 = vperm2f128_avx(auVar254,auVar254,1);
    auVar92 = vshufps_avx(auVar92,auVar254,0x30);
    auVar17 = vshufps_avx(auVar254,auVar92,0x29);
    auVar16 = vsubps_avx(auVar254,auVar25);
    auVar92 = vperm2f128_avx(auVar16,auVar16,1);
    auVar92 = vshufps_avx(auVar92,auVar16,0x30);
    _local_358 = vshufps_avx(auVar16,auVar92,0x29);
    auVar16 = vsubps_avx(auVar283,auVar26);
    auVar92 = vperm2f128_avx(auVar16,auVar16,1);
    auVar92 = vshufps_avx(auVar92,auVar16,0x30);
    _local_488 = vshufps_avx(auVar16,auVar92,0x29);
    auVar16 = vsubps_avx(auVar254,local_b8);
    auVar18 = vsubps_avx(auVar17,_local_2b8);
    fVar194 = auVar18._0_4_ + auVar16._0_4_;
    fVar221 = auVar18._4_4_ + auVar16._4_4_;
    fVar215 = auVar18._8_4_ + auVar16._8_4_;
    fVar234 = auVar18._12_4_ + auVar16._12_4_;
    fVar216 = auVar18._16_4_ + auVar16._16_4_;
    fVar235 = auVar18._20_4_ + auVar16._20_4_;
    fVar217 = auVar18._24_4_ + auVar16._24_4_;
    auVar92 = vperm2f128_avx(auVar170,auVar170,1);
    auVar92 = vshufps_avx(auVar92,auVar170,0x30);
    local_d8 = vshufps_avx(auVar170,auVar92,0x29);
    auVar92 = vperm2f128_avx(auVar283,auVar283,1);
    auVar92 = vshufps_avx(auVar92,auVar283,0x30);
    local_98 = vshufps_avx(auVar283,auVar92,0x29);
    auVar92 = vsubps_avx(auVar283,auVar170);
    auVar19 = vsubps_avx(local_98,local_d8);
    fVar236 = auVar19._0_4_ + auVar92._0_4_;
    fVar218 = auVar19._4_4_ + auVar92._4_4_;
    fVar237 = auVar19._8_4_ + auVar92._8_4_;
    fVar219 = auVar19._12_4_ + auVar92._12_4_;
    fVar239 = auVar19._16_4_ + auVar92._16_4_;
    fVar220 = auVar19._20_4_ + auVar92._20_4_;
    fVar240 = auVar19._24_4_ + auVar92._24_4_;
    auVar27._4_4_ = fVar221 * auVar170._4_4_;
    auVar27._0_4_ = fVar194 * auVar170._0_4_;
    auVar27._8_4_ = fVar215 * auVar170._8_4_;
    auVar27._12_4_ = fVar234 * auVar170._12_4_;
    auVar27._16_4_ = fVar216 * auVar170._16_4_;
    auVar27._20_4_ = fVar235 * auVar170._20_4_;
    auVar27._24_4_ = fVar217 * auVar170._24_4_;
    auVar27._28_4_ = auVar92._28_4_;
    auVar28._4_4_ = fVar218 * local_b8._4_4_;
    auVar28._0_4_ = fVar236 * local_b8._0_4_;
    auVar28._8_4_ = fVar237 * local_b8._8_4_;
    auVar28._12_4_ = fVar219 * local_b8._12_4_;
    auVar28._16_4_ = fVar239 * local_b8._16_4_;
    auVar28._20_4_ = fVar220 * local_b8._20_4_;
    auVar28._24_4_ = fVar240 * local_b8._24_4_;
    auVar28._28_4_ = fVar311;
    auVar20 = vsubps_avx(auVar27,auVar28);
    local_f8 = local_b8._0_4_ + local_f8;
    fStack_f4 = local_b8._4_4_ + fStack_f4;
    fStack_f0 = local_b8._8_4_ + fStack_f0;
    fStack_ec = local_b8._12_4_ + fStack_ec;
    fStack_e8 = local_b8._16_4_ + fStack_e8;
    fStack_e4 = local_b8._20_4_ + fStack_e4;
    fStack_e0 = local_b8._24_4_ + fStack_e0;
    fStack_dc = local_b8._28_4_ + auVar15._28_4_;
    local_118 = local_118 + auVar170._0_4_;
    fStack_114 = fStack_114 + auVar170._4_4_;
    fStack_110 = fStack_110 + auVar170._8_4_;
    fStack_10c = fStack_10c + auVar170._12_4_;
    fStack_108 = fStack_108 + auVar170._16_4_;
    fStack_104 = fStack_104 + auVar170._20_4_;
    fStack_100 = fStack_100 + auVar170._24_4_;
    fStack_fc = fVar314 + auVar170._28_4_;
    auVar29._4_4_ = fVar221 * fStack_114;
    auVar29._0_4_ = fVar194 * local_118;
    auVar29._8_4_ = fVar215 * fStack_110;
    auVar29._12_4_ = fVar234 * fStack_10c;
    auVar29._16_4_ = fVar216 * fStack_108;
    auVar29._20_4_ = fVar235 * fStack_104;
    auVar29._24_4_ = fVar217 * fStack_100;
    auVar29._28_4_ = fVar314;
    auVar30._4_4_ = fVar218 * fStack_f4;
    auVar30._0_4_ = fVar236 * local_f8;
    auVar30._8_4_ = fVar237 * fStack_f0;
    auVar30._12_4_ = fVar219 * fStack_ec;
    auVar30._16_4_ = fVar239 * fStack_e8;
    auVar30._20_4_ = fVar220 * fStack_e4;
    auVar30._24_4_ = fVar240 * fStack_e0;
    auVar30._28_4_ = fVar314 + auVar170._28_4_;
    auVar15 = vsubps_avx(auVar29,auVar30);
    local_438._0_4_ = auVar13._0_4_;
    local_438._4_4_ = auVar13._4_4_;
    fStack_430 = auVar13._8_4_;
    fStack_42c = auVar13._12_4_;
    fStack_428 = auVar13._16_4_;
    fStack_424 = auVar13._20_4_;
    fStack_420 = auVar13._24_4_;
    auVar31._4_4_ = fVar221 * (float)local_438._4_4_;
    auVar31._0_4_ = fVar194 * (float)local_438._0_4_;
    auVar31._8_4_ = fVar215 * fStack_430;
    auVar31._12_4_ = fVar234 * fStack_42c;
    auVar31._16_4_ = fVar216 * fStack_428;
    auVar31._20_4_ = fVar235 * fStack_424;
    auVar31._24_4_ = fVar217 * fStack_420;
    auVar31._28_4_ = fVar314;
    auVar32._4_4_ = fVar218 * (float)local_458._4_4_;
    auVar32._0_4_ = fVar236 * (float)local_458._0_4_;
    auVar32._8_4_ = fVar237 * fStack_450;
    auVar32._12_4_ = fVar219 * fStack_44c;
    auVar32._16_4_ = fVar239 * fStack_448;
    auVar32._20_4_ = fVar220 * fStack_444;
    auVar32._24_4_ = fVar240 * fStack_440;
    auVar32._28_4_ = local_b8._28_4_;
    auVar21 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = local_d8._4_4_ * fVar221;
    auVar33._0_4_ = local_d8._0_4_ * fVar194;
    auVar33._8_4_ = local_d8._8_4_ * fVar215;
    auVar33._12_4_ = local_d8._12_4_ * fVar234;
    auVar33._16_4_ = local_d8._16_4_ * fVar216;
    auVar33._20_4_ = local_d8._20_4_ * fVar235;
    auVar33._24_4_ = local_d8._24_4_ * fVar217;
    auVar33._28_4_ = fVar314;
    auVar34._4_4_ = local_2b8._4_4_ * fVar218;
    auVar34._0_4_ = local_2b8._0_4_ * fVar236;
    auVar34._8_4_ = local_2b8._8_4_ * fVar237;
    auVar34._12_4_ = local_2b8._12_4_ * fVar219;
    auVar34._16_4_ = local_2b8._16_4_ * fVar239;
    auVar34._20_4_ = local_2b8._20_4_ * fVar220;
    auVar34._24_4_ = local_2b8._24_4_ * fVar240;
    auVar34._28_4_ = local_d8._28_4_;
    auVar22 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar283._4_4_ * fVar221;
    auVar35._0_4_ = auVar283._0_4_ * fVar194;
    auVar35._8_4_ = auVar283._8_4_ * fVar215;
    auVar35._12_4_ = auVar283._12_4_ * fVar234;
    auVar35._16_4_ = auVar283._16_4_ * fVar216;
    auVar35._20_4_ = auVar283._20_4_ * fVar235;
    auVar35._24_4_ = auVar283._24_4_ * fVar217;
    auVar35._28_4_ = fVar314;
    auVar36._4_4_ = fVar218 * auVar254._4_4_;
    auVar36._0_4_ = fVar236 * auVar254._0_4_;
    auVar36._8_4_ = fVar237 * auVar254._8_4_;
    auVar36._12_4_ = fVar219 * auVar254._12_4_;
    auVar36._16_4_ = fVar239 * auVar254._16_4_;
    auVar36._20_4_ = fVar220 * auVar254._20_4_;
    auVar36._24_4_ = fVar240 * auVar254._24_4_;
    auVar36._28_4_ = fStack_dc;
    auVar93 = vsubps_avx(auVar35,auVar36);
    local_138 = auVar254._0_4_ + local_138;
    fStack_134 = auVar254._4_4_ + fStack_134;
    fStack_130 = auVar254._8_4_ + fStack_130;
    fStack_12c = auVar254._12_4_ + fStack_12c;
    fStack_128 = auVar254._16_4_ + fStack_128;
    fStack_124 = auVar254._20_4_ + fStack_124;
    fStack_120 = auVar254._24_4_ + fStack_120;
    fStack_11c = auVar254._28_4_ + auVar14._28_4_;
    local_158 = auVar283._0_4_ + local_158;
    fStack_154 = auVar283._4_4_ + fStack_154;
    fStack_150 = auVar283._8_4_ + fStack_150;
    fStack_14c = auVar283._12_4_ + fStack_14c;
    fStack_148 = auVar283._16_4_ + fStack_148;
    fStack_144 = auVar283._20_4_ + fStack_144;
    fStack_140 = auVar283._24_4_ + fStack_140;
    fStack_13c = auVar283._28_4_ + auVar213._28_4_;
    auVar37._4_4_ = fVar221 * fStack_154;
    auVar37._0_4_ = fVar194 * local_158;
    auVar37._8_4_ = fVar215 * fStack_150;
    auVar37._12_4_ = fVar234 * fStack_14c;
    auVar37._16_4_ = fVar216 * fStack_148;
    auVar37._20_4_ = fVar235 * fStack_144;
    auVar37._24_4_ = fVar217 * fStack_140;
    auVar37._28_4_ = auVar283._28_4_ + auVar213._28_4_;
    auVar38._4_4_ = fStack_134 * fVar218;
    auVar38._0_4_ = local_138 * fVar236;
    auVar38._8_4_ = fStack_130 * fVar237;
    auVar38._12_4_ = fStack_12c * fVar219;
    auVar38._16_4_ = fStack_128 * fVar239;
    auVar38._20_4_ = fStack_124 * fVar220;
    auVar38._24_4_ = fStack_120 * fVar240;
    auVar38._28_4_ = fStack_11c;
    auVar94 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = fVar221 * local_488._4_4_;
    auVar39._0_4_ = fVar194 * local_488._0_4_;
    auVar39._8_4_ = fVar215 * local_488._8_4_;
    auVar39._12_4_ = fVar234 * local_488._12_4_;
    auVar39._16_4_ = fVar216 * local_488._16_4_;
    auVar39._20_4_ = fVar235 * local_488._20_4_;
    auVar39._24_4_ = fVar217 * local_488._24_4_;
    auVar39._28_4_ = fStack_11c;
    auVar40._4_4_ = fVar218 * (float)local_358._4_4_;
    auVar40._0_4_ = fVar236 * (float)local_358._0_4_;
    auVar40._8_4_ = fVar237 * fStack_350;
    auVar40._12_4_ = fVar219 * fStack_34c;
    auVar40._16_4_ = fVar239 * fStack_348;
    auVar40._20_4_ = fVar220 * fStack_344;
    auVar40._24_4_ = fVar240 * fStack_340;
    auVar40._28_4_ = local_488._28_4_;
    auVar127 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = fVar221 * local_98._4_4_;
    auVar41._0_4_ = fVar194 * local_98._0_4_;
    auVar41._8_4_ = fVar215 * local_98._8_4_;
    auVar41._12_4_ = fVar234 * local_98._12_4_;
    auVar41._16_4_ = fVar216 * local_98._16_4_;
    auVar41._20_4_ = fVar235 * local_98._20_4_;
    auVar41._24_4_ = fVar217 * local_98._24_4_;
    auVar41._28_4_ = auVar18._28_4_ + auVar16._28_4_;
    auVar42._4_4_ = auVar17._4_4_ * fVar218;
    auVar42._0_4_ = auVar17._0_4_ * fVar236;
    auVar42._8_4_ = auVar17._8_4_ * fVar237;
    auVar42._12_4_ = auVar17._12_4_ * fVar219;
    auVar42._16_4_ = auVar17._16_4_ * fVar239;
    auVar42._20_4_ = auVar17._20_4_ * fVar220;
    auVar42._24_4_ = auVar17._24_4_ * fVar240;
    auVar42._28_4_ = auVar19._28_4_ + auVar92._28_4_;
    auVar18 = vsubps_avx(auVar41,auVar42);
    auVar13 = vminps_avx(auVar20,auVar15);
    auVar92 = vmaxps_avx(auVar20,auVar15);
    auVar14 = vminps_avx(auVar21,auVar22);
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(auVar21,auVar22);
    auVar92 = vmaxps_avx(auVar92,auVar13);
    auVar15 = vminps_avx(auVar93,auVar94);
    auVar13 = vmaxps_avx(auVar93,auVar94);
    auVar16 = vminps_avx(auVar127,auVar18);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar16 = vminps_avx(auVar14,auVar16);
    auVar14 = vmaxps_avx(auVar127,auVar18);
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(auVar92,auVar13);
    auVar92 = vcmpps_avx(auVar16,local_1d8,2);
    auVar13 = vcmpps_avx(auVar13,local_78,5);
    auVar92 = vandps_avx(auVar13,auVar92);
    auVar13 = local_178 & auVar92;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar13 = vsubps_avx(_local_2b8,local_b8);
      auVar14 = vsubps_avx(auVar17,auVar254);
      fVar221 = auVar13._0_4_ + auVar14._0_4_;
      fVar215 = auVar13._4_4_ + auVar14._4_4_;
      fVar234 = auVar13._8_4_ + auVar14._8_4_;
      fVar216 = auVar13._12_4_ + auVar14._12_4_;
      fVar235 = auVar13._16_4_ + auVar14._16_4_;
      fVar217 = auVar13._20_4_ + auVar14._20_4_;
      fVar236 = auVar13._24_4_ + auVar14._24_4_;
      auVar16 = vsubps_avx(local_d8,auVar170);
      auVar18 = vsubps_avx(local_98,auVar283);
      fVar218 = auVar16._0_4_ + auVar18._0_4_;
      fVar237 = auVar16._4_4_ + auVar18._4_4_;
      fVar219 = auVar16._8_4_ + auVar18._8_4_;
      fVar239 = auVar16._12_4_ + auVar18._12_4_;
      fVar220 = auVar16._16_4_ + auVar18._16_4_;
      fVar240 = auVar16._20_4_ + auVar18._20_4_;
      fVar171 = auVar16._24_4_ + auVar18._24_4_;
      fVar194 = auVar18._28_4_;
      auVar43._4_4_ = auVar170._4_4_ * fVar215;
      auVar43._0_4_ = auVar170._0_4_ * fVar221;
      auVar43._8_4_ = auVar170._8_4_ * fVar234;
      auVar43._12_4_ = auVar170._12_4_ * fVar216;
      auVar43._16_4_ = auVar170._16_4_ * fVar235;
      auVar43._20_4_ = auVar170._20_4_ * fVar217;
      auVar43._24_4_ = auVar170._24_4_ * fVar236;
      auVar43._28_4_ = auVar170._28_4_;
      auVar44._4_4_ = local_b8._4_4_ * fVar237;
      auVar44._0_4_ = local_b8._0_4_ * fVar218;
      auVar44._8_4_ = local_b8._8_4_ * fVar219;
      auVar44._12_4_ = local_b8._12_4_ * fVar239;
      auVar44._16_4_ = local_b8._16_4_ * fVar220;
      auVar44._20_4_ = local_b8._20_4_ * fVar240;
      auVar44._24_4_ = local_b8._24_4_ * fVar171;
      auVar44._28_4_ = local_b8._28_4_;
      auVar18 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar215 * fStack_114;
      auVar45._0_4_ = fVar221 * local_118;
      auVar45._8_4_ = fVar234 * fStack_110;
      auVar45._12_4_ = fVar216 * fStack_10c;
      auVar45._16_4_ = fVar235 * fStack_108;
      auVar45._20_4_ = fVar217 * fStack_104;
      auVar45._24_4_ = fVar236 * fStack_100;
      auVar45._28_4_ = auVar170._28_4_;
      auVar46._4_4_ = fVar237 * fStack_f4;
      auVar46._0_4_ = fVar218 * local_f8;
      auVar46._8_4_ = fVar219 * fStack_f0;
      auVar46._12_4_ = fVar239 * fStack_ec;
      auVar46._16_4_ = fVar220 * fStack_e8;
      auVar46._20_4_ = fVar240 * fStack_e4;
      auVar46._24_4_ = fVar171 * fStack_e0;
      auVar46._28_4_ = fVar194;
      auVar19 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar215 * (float)local_438._4_4_;
      auVar47._0_4_ = fVar221 * (float)local_438._0_4_;
      auVar47._8_4_ = fVar234 * fStack_430;
      auVar47._12_4_ = fVar216 * fStack_42c;
      auVar47._16_4_ = fVar235 * fStack_428;
      auVar47._20_4_ = fVar217 * fStack_424;
      auVar47._24_4_ = fVar236 * fStack_420;
      auVar47._28_4_ = fVar194;
      auVar48._4_4_ = fVar237 * (float)local_458._4_4_;
      auVar48._0_4_ = fVar218 * (float)local_458._0_4_;
      auVar48._8_4_ = fVar219 * fStack_450;
      auVar48._12_4_ = fVar239 * fStack_44c;
      auVar48._16_4_ = fVar220 * fStack_448;
      auVar48._20_4_ = fVar240 * fStack_444;
      auVar48._24_4_ = fVar171 * fStack_440;
      auVar48._28_4_ = auVar15._28_4_;
      auVar20 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = local_d8._4_4_ * fVar215;
      auVar49._0_4_ = local_d8._0_4_ * fVar221;
      auVar49._8_4_ = local_d8._8_4_ * fVar234;
      auVar49._12_4_ = local_d8._12_4_ * fVar216;
      auVar49._16_4_ = local_d8._16_4_ * fVar235;
      auVar49._20_4_ = local_d8._20_4_ * fVar217;
      auVar49._24_4_ = local_d8._24_4_ * fVar236;
      auVar49._28_4_ = auVar15._28_4_;
      auVar50._4_4_ = local_2b8._4_4_ * fVar237;
      auVar50._0_4_ = local_2b8._0_4_ * fVar218;
      auVar50._8_4_ = local_2b8._8_4_ * fVar219;
      auVar50._12_4_ = local_2b8._12_4_ * fVar239;
      auVar50._16_4_ = local_2b8._16_4_ * fVar220;
      auVar50._20_4_ = local_2b8._20_4_ * fVar240;
      uVar2 = local_2b8._28_4_;
      auVar50._24_4_ = local_2b8._24_4_ * fVar171;
      auVar50._28_4_ = uVar2;
      auVar21 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = auVar283._4_4_ * fVar215;
      auVar51._0_4_ = auVar283._0_4_ * fVar221;
      auVar51._8_4_ = auVar283._8_4_ * fVar234;
      auVar51._12_4_ = auVar283._12_4_ * fVar216;
      auVar51._16_4_ = auVar283._16_4_ * fVar235;
      auVar51._20_4_ = auVar283._20_4_ * fVar217;
      auVar51._24_4_ = auVar283._24_4_ * fVar236;
      auVar51._28_4_ = uVar2;
      auVar52._4_4_ = auVar254._4_4_ * fVar237;
      auVar52._0_4_ = auVar254._0_4_ * fVar218;
      auVar52._8_4_ = auVar254._8_4_ * fVar219;
      auVar52._12_4_ = auVar254._12_4_ * fVar239;
      auVar52._16_4_ = auVar254._16_4_ * fVar220;
      auVar52._20_4_ = auVar254._20_4_ * fVar240;
      auVar52._24_4_ = auVar254._24_4_ * fVar171;
      auVar52._28_4_ = auVar254._28_4_;
      auVar22 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar215 * fStack_154;
      auVar53._0_4_ = fVar221 * local_158;
      auVar53._8_4_ = fVar234 * fStack_150;
      auVar53._12_4_ = fVar216 * fStack_14c;
      auVar53._16_4_ = fVar235 * fStack_148;
      auVar53._20_4_ = fVar217 * fStack_144;
      auVar53._24_4_ = fVar236 * fStack_140;
      auVar53._28_4_ = uVar2;
      auVar54._4_4_ = fVar237 * fStack_134;
      auVar54._0_4_ = fVar218 * local_138;
      auVar54._8_4_ = fVar219 * fStack_130;
      auVar54._12_4_ = fVar239 * fStack_12c;
      auVar54._16_4_ = fVar220 * fStack_128;
      auVar54._20_4_ = fVar240 * fStack_124;
      auVar54._24_4_ = fVar171 * fStack_120;
      auVar54._28_4_ = auVar283._28_4_;
      auVar93 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = fVar215 * local_488._4_4_;
      auVar55._0_4_ = fVar221 * local_488._0_4_;
      auVar55._8_4_ = fVar234 * local_488._8_4_;
      auVar55._12_4_ = fVar216 * local_488._12_4_;
      auVar55._16_4_ = fVar235 * local_488._16_4_;
      auVar55._20_4_ = fVar217 * local_488._20_4_;
      auVar55._24_4_ = fVar236 * local_488._24_4_;
      auVar55._28_4_ = auVar283._28_4_;
      auVar56._4_4_ = (float)local_358._4_4_ * fVar237;
      auVar56._0_4_ = (float)local_358._0_4_ * fVar218;
      auVar56._8_4_ = fStack_350 * fVar219;
      auVar56._12_4_ = fStack_34c * fVar239;
      auVar56._16_4_ = fStack_348 * fVar220;
      auVar56._20_4_ = fStack_344 * fVar240;
      auVar56._24_4_ = fStack_340 * fVar171;
      auVar56._28_4_ = local_d8._28_4_;
      auVar94 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = local_98._4_4_ * fVar215;
      auVar57._0_4_ = local_98._0_4_ * fVar221;
      auVar57._8_4_ = local_98._8_4_ * fVar234;
      auVar57._12_4_ = local_98._12_4_ * fVar216;
      auVar57._16_4_ = local_98._16_4_ * fVar235;
      auVar57._20_4_ = local_98._20_4_ * fVar217;
      auVar57._24_4_ = local_98._24_4_ * fVar236;
      auVar57._28_4_ = auVar13._28_4_ + auVar14._28_4_;
      auVar58._4_4_ = auVar17._4_4_ * fVar237;
      auVar58._0_4_ = auVar17._0_4_ * fVar218;
      auVar58._8_4_ = auVar17._8_4_ * fVar219;
      auVar58._12_4_ = auVar17._12_4_ * fVar239;
      auVar58._16_4_ = auVar17._16_4_ * fVar220;
      auVar58._20_4_ = auVar17._20_4_ * fVar240;
      auVar58._24_4_ = auVar17._24_4_ * fVar171;
      auVar58._28_4_ = auVar16._28_4_ + fVar194;
      auVar127 = vsubps_avx(auVar57,auVar58);
      auVar14 = vminps_avx(auVar18,auVar19);
      auVar13 = vmaxps_avx(auVar18,auVar19);
      auVar15 = vminps_avx(auVar20,auVar21);
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar20,auVar21);
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar16 = vminps_avx(auVar22,auVar93);
      auVar14 = vmaxps_avx(auVar22,auVar93);
      auVar17 = vminps_avx(auVar94,auVar127);
      auVar16 = vminps_avx(auVar16,auVar17);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar94,auVar127);
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vcmpps_avx(auVar16,local_1d8,2);
      auVar14 = vcmpps_avx(auVar14,local_78,5);
      auVar13 = vandps_avx(auVar14,auVar13);
      auVar92 = vandps_avx(local_178,auVar92);
      auVar14 = auVar92 & auVar13;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar92 = vandps_avx(auVar13,auVar92);
        uVar68 = vmovmskps_avx(auVar92);
        if (uVar68 != 0) {
          uVar66 = (ulong)uVar65;
          auStack_298[uVar66] = uVar68 & 0xff;
          uVar3 = vmovlps_avx(local_218);
          *(undefined8 *)(afStack_1b8 + uVar66 * 2) = uVar3;
          uVar70 = vmovlps_avx(auVar201);
          auStack_58[uVar66] = uVar70;
          uVar65 = uVar65 + 1;
        }
      }
    }
LAB_01092e88:
    do {
      do {
        do {
          do {
            if (uVar65 == 0) {
              if (bVar67) {
                return bVar67;
              }
              fVar194 = ray->tfar;
              auVar101._4_4_ = fVar194;
              auVar101._0_4_ = fVar194;
              auVar101._8_4_ = fVar194;
              auVar101._12_4_ = fVar194;
              auVar101._16_4_ = fVar194;
              auVar101._20_4_ = fVar194;
              auVar101._24_4_ = fVar194;
              auVar101._28_4_ = fVar194;
              auVar92 = vcmpps_avx(local_198,auVar101,2);
              uVar65 = vmovmskps_avx(auVar92);
              uVar65 = (uint)uVar71 & uVar65;
              if (uVar65 == 0) {
                return bVar67;
              }
              goto LAB_01092061;
            }
            uVar66 = (ulong)(uVar65 - 1);
            uVar68 = auStack_298[uVar66];
            fVar194 = afStack_1b8[uVar66 * 2];
            fVar221 = afStack_1b8[uVar66 * 2 + 1];
            auVar202._8_8_ = 0;
            auVar202._0_8_ = auStack_58[uVar66];
            auVar214 = ZEXT1664(auVar202);
            uVar70 = 0;
            if (uVar68 != 0) {
              for (; (uVar68 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
              }
            }
            uVar68 = uVar68 - 1 & uVar68;
            auStack_298[uVar66] = uVar68;
            if (uVar68 == 0) {
              uVar65 = uVar65 - 1;
            }
            auVar255 = ZEXT1664(local_378);
            auVar269 = ZEXT1664(local_388);
            auVar284 = ZEXT1664(local_398);
            auVar303 = ZEXT1664(local_3a8);
            auVar307 = ZEXT1664(local_3b8);
            fVar234 = (float)(uVar70 + 1) * 0.14285715;
            fVar215 = (1.0 - (float)uVar70 * 0.14285715) * fVar194 +
                      fVar221 * (float)uVar70 * 0.14285715;
            fVar234 = (1.0 - fVar234) * fVar194 + fVar221 * fVar234;
            fVar216 = fVar234 - fVar215;
            fVar220 = (float)local_498;
            fVar240 = local_498._4_4_;
            fVar194 = (float)uStack_490;
            fVar221 = uStack_490._4_4_;
            if (0.16666667 <= fVar216) {
              auVar81 = vinsertps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar234),0x10);
              auVar318 = ZEXT1664(auVar81);
              auVar158 = ZEXT1664(_local_368);
              goto LAB_01092831;
            }
            auVar81 = vshufps_avx(auVar202,auVar202,0x50);
            auVar109._8_4_ = 0x3f800000;
            auVar109._0_8_ = 0x3f8000003f800000;
            auVar109._12_4_ = 0x3f800000;
            auVar260 = vsubps_avx(auVar109,auVar81);
            fVar235 = auVar81._0_4_;
            fVar217 = auVar81._4_4_;
            fVar236 = auVar81._8_4_;
            fVar218 = auVar81._12_4_;
            fVar237 = auVar260._0_4_;
            fVar219 = auVar260._4_4_;
            fVar239 = auVar260._8_4_;
            fVar171 = auVar260._12_4_;
            auVar138._0_4_ = fVar235 * (float)local_368._0_4_ + fVar237 * (float)local_498;
            auVar138._4_4_ = fVar217 * (float)local_368._4_4_ + fVar219 * local_498._4_4_;
            auVar138._8_4_ = fVar236 * fStack_360 + fVar239 * (float)uStack_490;
            auVar138._12_4_ = fVar218 * fStack_35c + fVar171 * uStack_490._4_4_;
            auVar174._0_4_ = local_398._0_4_ * fVar235 + fVar237 * local_378._0_4_;
            auVar174._4_4_ = local_398._4_4_ * fVar217 + fVar219 * local_378._4_4_;
            auVar174._8_4_ = local_398._8_4_ * fVar236 + fVar239 * local_378._8_4_;
            auVar174._12_4_ = local_398._12_4_ * fVar218 + fVar171 * local_378._12_4_;
            auVar203._0_4_ = local_3a8._0_4_ * fVar235 + auVar328._0_4_ * fVar237;
            auVar203._4_4_ = local_3a8._4_4_ * fVar217 + auVar328._4_4_ * fVar219;
            auVar203._8_4_ = local_3a8._8_4_ * fVar236 + auVar328._0_4_ * fVar239;
            auVar203._12_4_ = local_3a8._12_4_ * fVar218 + auVar328._4_4_ * fVar171;
            auVar78._0_4_ = local_3b8._0_4_ * fVar235 + local_388._0_4_ * fVar237;
            auVar78._4_4_ = local_3b8._4_4_ * fVar217 + local_388._4_4_ * fVar219;
            auVar78._8_4_ = local_3b8._8_4_ * fVar236 + local_388._8_4_ * fVar239;
            auVar78._12_4_ = local_3b8._12_4_ * fVar218 + local_388._12_4_ * fVar171;
            auVar132._16_16_ = auVar138;
            auVar132._0_16_ = auVar138;
            auVar156._16_16_ = auVar174;
            auVar156._0_16_ = auVar174;
            auVar187._16_16_ = auVar203;
            auVar187._0_16_ = auVar203;
            _local_438 = ZEXT432((uint)fVar215);
            _local_458 = ZEXT416((uint)fVar234);
            auVar92 = ZEXT2032(CONCAT416(fVar234,ZEXT416((uint)fVar215)));
            auVar92 = vshufps_avx(auVar92,auVar92,0);
            auVar13 = vsubps_avx(auVar156,auVar132);
            fVar235 = auVar92._0_4_;
            fVar217 = auVar92._4_4_;
            fVar236 = auVar92._8_4_;
            fVar218 = auVar92._12_4_;
            fVar237 = auVar92._16_4_;
            fVar219 = auVar92._20_4_;
            fVar239 = auVar92._24_4_;
            auVar133._0_4_ = auVar138._0_4_ + auVar13._0_4_ * fVar235;
            auVar133._4_4_ = auVar138._4_4_ + auVar13._4_4_ * fVar217;
            auVar133._8_4_ = auVar138._8_4_ + auVar13._8_4_ * fVar236;
            auVar133._12_4_ = auVar138._12_4_ + auVar13._12_4_ * fVar218;
            auVar133._16_4_ = auVar138._0_4_ + auVar13._16_4_ * fVar237;
            auVar133._20_4_ = auVar138._4_4_ + auVar13._20_4_ * fVar219;
            auVar133._24_4_ = auVar138._8_4_ + auVar13._24_4_ * fVar239;
            auVar133._28_4_ = auVar138._12_4_ + auVar13._28_4_;
            auVar92 = vsubps_avx(auVar187,auVar156);
            auVar157._0_4_ = auVar174._0_4_ + auVar92._0_4_ * fVar235;
            auVar157._4_4_ = auVar174._4_4_ + auVar92._4_4_ * fVar217;
            auVar157._8_4_ = auVar174._8_4_ + auVar92._8_4_ * fVar236;
            auVar157._12_4_ = auVar174._12_4_ + auVar92._12_4_ * fVar218;
            auVar157._16_4_ = auVar174._0_4_ + auVar92._16_4_ * fVar237;
            auVar157._20_4_ = auVar174._4_4_ + auVar92._20_4_ * fVar219;
            auVar157._24_4_ = auVar174._8_4_ + auVar92._24_4_ * fVar239;
            auVar157._28_4_ = auVar174._12_4_ + auVar92._28_4_;
            auVar81 = vsubps_avx(auVar78,auVar203);
            auVar99._0_4_ = auVar203._0_4_ + auVar81._0_4_ * fVar235;
            auVar99._4_4_ = auVar203._4_4_ + auVar81._4_4_ * fVar217;
            auVar99._8_4_ = auVar203._8_4_ + auVar81._8_4_ * fVar236;
            auVar99._12_4_ = auVar203._12_4_ + auVar81._12_4_ * fVar218;
            auVar99._16_4_ = auVar203._0_4_ + auVar81._0_4_ * fVar237;
            auVar99._20_4_ = auVar203._4_4_ + auVar81._4_4_ * fVar219;
            auVar99._24_4_ = auVar203._8_4_ + auVar81._8_4_ * fVar239;
            auVar99._28_4_ = auVar203._12_4_ + auVar81._12_4_;
            auVar92 = vsubps_avx(auVar157,auVar133);
            auVar134._0_4_ = auVar133._0_4_ + fVar235 * auVar92._0_4_;
            auVar134._4_4_ = auVar133._4_4_ + fVar217 * auVar92._4_4_;
            auVar134._8_4_ = auVar133._8_4_ + fVar236 * auVar92._8_4_;
            auVar134._12_4_ = auVar133._12_4_ + fVar218 * auVar92._12_4_;
            auVar134._16_4_ = auVar133._16_4_ + fVar237 * auVar92._16_4_;
            auVar134._20_4_ = auVar133._20_4_ + fVar219 * auVar92._20_4_;
            auVar134._24_4_ = auVar133._24_4_ + fVar239 * auVar92._24_4_;
            auVar134._28_4_ = auVar133._28_4_ + auVar92._28_4_;
            auVar92 = vsubps_avx(auVar99,auVar157);
            auVar100._0_4_ = auVar157._0_4_ + fVar235 * auVar92._0_4_;
            auVar100._4_4_ = auVar157._4_4_ + fVar217 * auVar92._4_4_;
            auVar100._8_4_ = auVar157._8_4_ + fVar236 * auVar92._8_4_;
            auVar100._12_4_ = auVar157._12_4_ + fVar218 * auVar92._12_4_;
            auVar100._16_4_ = auVar157._16_4_ + fVar237 * auVar92._16_4_;
            auVar100._20_4_ = auVar157._20_4_ + fVar219 * auVar92._20_4_;
            auVar100._24_4_ = auVar157._24_4_ + fVar239 * auVar92._24_4_;
            auVar100._28_4_ = auVar157._28_4_ + auVar92._28_4_;
            auVar92 = vsubps_avx(auVar100,auVar134);
            auVar228._0_4_ = auVar134._0_4_ + fVar235 * auVar92._0_4_;
            auVar228._4_4_ = auVar134._4_4_ + fVar217 * auVar92._4_4_;
            auVar228._8_4_ = auVar134._8_4_ + fVar236 * auVar92._8_4_;
            auVar228._12_4_ = auVar134._12_4_ + fVar218 * auVar92._12_4_;
            auVar233._16_4_ = auVar134._16_4_ + fVar237 * auVar92._16_4_;
            auVar233._0_16_ = auVar228;
            auVar233._20_4_ = auVar134._20_4_ + fVar219 * auVar92._20_4_;
            auVar233._24_4_ = auVar134._24_4_ + fVar239 * auVar92._24_4_;
            auVar233._28_4_ = auVar134._28_4_ + auVar157._28_4_;
            auVar238 = auVar233._16_16_;
            auVar111 = vshufps_avx(ZEXT416((uint)(fVar216 * 0.33333334)),
                                   ZEXT416((uint)(fVar216 * 0.33333334)),0);
            auVar204._0_4_ = auVar228._0_4_ + auVar111._0_4_ * auVar92._0_4_ * 3.0;
            auVar204._4_4_ = auVar228._4_4_ + auVar111._4_4_ * auVar92._4_4_ * 3.0;
            auVar204._8_4_ = auVar228._8_4_ + auVar111._8_4_ * auVar92._8_4_ * 3.0;
            auVar204._12_4_ = auVar228._12_4_ + auVar111._12_4_ * auVar92._12_4_ * 3.0;
            auVar151 = vshufpd_avx(auVar228,auVar228,3);
            auVar122 = vshufpd_avx(auVar238,auVar238,3);
            _local_2b8 = auVar151;
            auVar81 = vsubps_avx(auVar151,auVar228);
            _local_488 = auVar122;
            auVar260 = vsubps_avx(auVar122,auVar238);
            auVar79._0_4_ = auVar81._0_4_ + auVar260._0_4_;
            auVar79._4_4_ = auVar81._4_4_ + auVar260._4_4_;
            auVar79._8_4_ = auVar81._8_4_ + auVar260._8_4_;
            auVar79._12_4_ = auVar81._12_4_ + auVar260._12_4_;
            auVar81 = vmovshdup_avx(auVar228);
            auVar260 = vmovshdup_avx(auVar204);
            auVar141 = vshufps_avx(auVar79,auVar79,0);
            auVar112 = vshufps_avx(auVar79,auVar79,0x55);
            fVar235 = auVar112._0_4_;
            fVar217 = auVar112._4_4_;
            fVar236 = auVar112._8_4_;
            fVar218 = auVar112._12_4_;
            fVar237 = auVar141._0_4_;
            fVar219 = auVar141._4_4_;
            fVar239 = auVar141._8_4_;
            fVar171 = auVar141._12_4_;
            auVar80._0_4_ = fVar237 * auVar228._0_4_ + auVar81._0_4_ * fVar235;
            auVar80._4_4_ = fVar219 * auVar228._4_4_ + auVar81._4_4_ * fVar217;
            auVar80._8_4_ = fVar239 * auVar228._8_4_ + auVar81._8_4_ * fVar236;
            auVar80._12_4_ = fVar171 * auVar228._12_4_ + auVar81._12_4_ * fVar218;
            _local_358 = auVar204;
            auVar139._0_4_ = fVar237 * auVar204._0_4_ + auVar260._0_4_ * fVar235;
            auVar139._4_4_ = fVar219 * auVar204._4_4_ + auVar260._4_4_ * fVar217;
            auVar139._8_4_ = fVar239 * auVar204._8_4_ + auVar260._8_4_ * fVar236;
            auVar139._12_4_ = fVar171 * auVar204._12_4_ + auVar260._12_4_ * fVar218;
            auVar260 = vshufps_avx(auVar80,auVar80,0xe8);
            auVar141 = vshufps_avx(auVar139,auVar139,0xe8);
            auVar81 = vcmpps_avx(auVar260,auVar141,1);
            uVar68 = vextractps_avx(auVar81,0);
            auVar112 = auVar139;
            if ((uVar68 & 1) == 0) {
              auVar112 = auVar80;
            }
            auVar110._0_4_ = auVar111._0_4_ * auVar92._16_4_ * 3.0;
            auVar110._4_4_ = auVar111._4_4_ * auVar92._20_4_ * 3.0;
            auVar110._8_4_ = auVar111._8_4_ * auVar92._24_4_ * 3.0;
            auVar110._12_4_ = auVar111._12_4_ * 0.0;
            auVar261 = vsubps_avx(auVar238,auVar110);
            auVar111 = vmovshdup_avx(auVar261);
            auVar238 = vmovshdup_avx(auVar238);
            fVar188 = auVar261._0_4_;
            fVar189 = auVar261._4_4_;
            auVar175._0_4_ = fVar188 * fVar237 + auVar111._0_4_ * fVar235;
            auVar175._4_4_ = fVar189 * fVar219 + auVar111._4_4_ * fVar217;
            auVar175._8_4_ = auVar261._8_4_ * fVar239 + auVar111._8_4_ * fVar236;
            auVar175._12_4_ = auVar261._12_4_ * fVar171 + auVar111._12_4_ * fVar218;
            auVar205._0_4_ = fVar237 * auVar233._16_4_ + auVar238._0_4_ * fVar235;
            auVar205._4_4_ = fVar219 * auVar233._20_4_ + auVar238._4_4_ * fVar217;
            auVar205._8_4_ = fVar239 * auVar233._24_4_ + auVar238._8_4_ * fVar236;
            auVar205._12_4_ = fVar171 * auVar233._28_4_ + auVar238._12_4_ * fVar218;
            auVar238 = vshufps_avx(auVar175,auVar175,0xe8);
            auVar5 = vshufps_avx(auVar205,auVar205,0xe8);
            auVar111 = vcmpps_avx(auVar238,auVar5,1);
            uVar68 = vextractps_avx(auVar111,0);
            auVar201 = auVar205;
            if ((uVar68 & 1) == 0) {
              auVar201 = auVar175;
            }
            auVar112 = vmaxss_avx(auVar201,auVar112);
            auVar260 = vminps_avx(auVar260,auVar141);
            auVar141 = vminps_avx(auVar238,auVar5);
            auVar141 = vminps_avx(auVar260,auVar141);
            auVar81 = vshufps_avx(auVar81,auVar81,0x55);
            auVar81 = vblendps_avx(auVar81,auVar111,2);
            auVar111 = vpslld_avx(auVar81,0x1f);
            auVar81 = vshufpd_avx(auVar139,auVar139,1);
            auVar81 = vinsertps_avx(auVar81,auVar205,0x9c);
            auVar260 = vshufpd_avx(auVar80,auVar80,1);
            auVar260 = vinsertps_avx(auVar260,auVar175,0x9c);
            auVar81 = vblendvps_avx(auVar260,auVar81,auVar111);
            auVar260 = vmovshdup_avx(auVar81);
            auVar81 = vmaxss_avx(auVar260,auVar81);
            fVar236 = auVar141._0_4_;
            auVar260 = vmovshdup_avx(auVar141);
            fVar217 = auVar81._0_4_;
            fVar218 = auVar260._0_4_;
            fVar235 = auVar112._0_4_;
            if ((fVar236 < 0.0001) && (-0.0001 < fVar217)) break;
            if ((fVar218 < 0.0001 && -0.0001 < fVar235) || (fVar236 < 0.0001 && -0.0001 < fVar235))
            break;
            auVar111 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar81,1);
            auVar260 = vcmpps_avx(auVar260,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar260 = vandps_avx(auVar260,auVar111);
          } while ((auVar260 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar111 = vcmpps_avx(auVar141,_DAT_01f7aa10,1);
          auVar260 = vcmpss_avx(auVar112,ZEXT416(0),1);
          auVar140._8_4_ = 0x3f800000;
          auVar140._0_8_ = 0x3f8000003f800000;
          auVar140._12_4_ = 0x3f800000;
          auVar176._8_4_ = 0xbf800000;
          auVar176._0_8_ = 0xbf800000bf800000;
          auVar176._12_4_ = 0xbf800000;
          auVar260 = vblendvps_avx(auVar140,auVar176,auVar260);
          auVar111 = vblendvps_avx(auVar140,auVar176,auVar111);
          auVar141 = vcmpss_avx(auVar111,auVar260,4);
          auVar141 = vpshufd_avx(ZEXT416(auVar141._0_4_ & 1),0x50);
          auVar141 = vpslld_avx(auVar141,0x1f);
          auVar141 = vpsrad_avx(auVar141,0x1f);
          auVar141 = vpandn_avx(auVar141,_DAT_01fafeb0);
          auVar112 = vmovshdup_avx(auVar111);
          fVar237 = auVar112._0_4_;
          if ((auVar111._0_4_ != fVar237) || (NAN(auVar111._0_4_) || NAN(fVar237))) {
            if ((fVar218 != fVar236) || (NAN(fVar218) || NAN(fVar236))) {
              fVar236 = -fVar236 / (fVar218 - fVar236);
              auVar111 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar236) * 0.0 + fVar236)));
            }
            else {
              auVar111 = ZEXT816(0x3f80000000000000);
              if ((fVar236 != 0.0) || (NAN(fVar236))) {
                auVar111 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar238 = vcmpps_avx(auVar141,auVar111,1);
            auVar112 = vblendps_avx(auVar141,auVar111,2);
            auVar111 = vblendps_avx(auVar111,auVar141,2);
            auVar141 = vblendvps_avx(auVar111,auVar112,auVar238);
          }
          auVar81 = vcmpss_avx(auVar81,ZEXT416(0),1);
          auVar142._8_4_ = 0x3f800000;
          auVar142._0_8_ = 0x3f8000003f800000;
          auVar142._12_4_ = 0x3f800000;
          auVar177._8_4_ = 0xbf800000;
          auVar177._0_8_ = 0xbf800000bf800000;
          auVar177._12_4_ = 0xbf800000;
          auVar81 = vblendvps_avx(auVar142,auVar177,auVar81);
          fVar236 = auVar81._0_4_;
          if ((auVar260._0_4_ != fVar236) || (NAN(auVar260._0_4_) || NAN(fVar236))) {
            if ((fVar217 != fVar235) || (NAN(fVar217) || NAN(fVar235))) {
              fVar235 = -fVar235 / (fVar217 - fVar235);
              auVar81 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar235) * 0.0 + fVar235)));
            }
            else {
              auVar81 = ZEXT816(0x3f80000000000000);
              if ((fVar235 != 0.0) || (NAN(fVar235))) {
                auVar81 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar111 = vcmpps_avx(auVar141,auVar81,1);
            auVar260 = vblendps_avx(auVar141,auVar81,2);
            auVar81 = vblendps_avx(auVar81,auVar141,2);
            auVar141 = vblendvps_avx(auVar81,auVar260,auVar111);
          }
          if ((fVar237 != fVar236) || (NAN(fVar237) || NAN(fVar236))) {
            auVar82._8_4_ = 0x3f800000;
            auVar82._0_8_ = 0x3f8000003f800000;
            auVar82._12_4_ = 0x3f800000;
            auVar81 = vcmpps_avx(auVar141,auVar82,1);
            auVar260 = vinsertps_avx(auVar141,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar143._4_12_ = auVar141._4_12_;
            auVar143._0_4_ = 0x3f800000;
            auVar141 = vblendvps_avx(auVar143,auVar260,auVar81);
          }
          auVar81 = vcmpps_avx(auVar141,_DAT_01f7b6f0,1);
          auVar59._12_4_ = 0;
          auVar59._0_12_ = auVar141._4_12_;
          auVar260 = vinsertps_avx(auVar141,ZEXT416(0x3f800000),0x10);
          auVar81 = vblendvps_avx(auVar260,auVar59 << 0x20,auVar81);
          auVar260 = vmovshdup_avx(auVar81);
        } while (auVar260._0_4_ < auVar81._0_4_);
        auVar83._0_4_ = auVar81._0_4_ + -0.1;
        auVar83._4_4_ = auVar81._4_4_ + 0.1;
        auVar83._8_4_ = auVar81._8_4_ + 0.0;
        auVar83._12_4_ = auVar81._12_4_ + 0.0;
        auVar111 = vshufpd_avx(auVar204,auVar204,3);
        register0x00001388 = 0x3f80000000000000;
        local_358 = 0x3f80000000000000;
        auVar81 = vcmpps_avx(auVar83,_local_358,1);
        auVar60._12_4_ = 0;
        auVar60._0_12_ = auVar83._4_12_;
        auVar260 = vinsertps_avx(auVar83,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar81 = vblendvps_avx(auVar260,auVar60 << 0x20,auVar81);
        auVar260 = vshufpd_avx(auVar261,auVar261,3);
        auVar141 = vshufps_avx(auVar81,auVar81,0x50);
        auVar229._8_4_ = 0x3f800000;
        auVar229._0_8_ = 0x3f8000003f800000;
        auVar229._12_4_ = 0x3f800000;
        auVar112 = vsubps_avx(auVar229,auVar141);
        local_2b8._0_4_ = auVar151._0_4_;
        local_2b8._4_4_ = auVar151._4_4_;
        fStack_2b0 = auVar151._8_4_;
        fStack_2ac = auVar151._12_4_;
        fVar235 = auVar141._0_4_;
        fVar217 = auVar141._4_4_;
        fVar236 = auVar141._8_4_;
        fVar218 = auVar141._12_4_;
        local_488._0_4_ = auVar122._0_4_;
        local_488._4_4_ = auVar122._4_4_;
        fStack_480 = auVar122._8_4_;
        fStack_47c = auVar122._12_4_;
        fVar237 = auVar112._0_4_;
        fVar219 = auVar112._4_4_;
        fVar239 = auVar112._8_4_;
        fVar171 = auVar112._12_4_;
        auVar84._0_4_ = fVar235 * (float)local_2b8._0_4_ + fVar237 * auVar228._0_4_;
        auVar84._4_4_ = fVar217 * (float)local_2b8._4_4_ + fVar219 * auVar228._4_4_;
        auVar84._8_4_ = fVar236 * fStack_2b0 + fVar239 * auVar228._0_4_;
        auVar84._12_4_ = fVar218 * fStack_2ac + fVar171 * auVar228._4_4_;
        auVar144._0_4_ = fVar235 * auVar111._0_4_ + fVar237 * auVar204._0_4_;
        auVar144._4_4_ = fVar217 * auVar111._4_4_ + fVar219 * auVar204._4_4_;
        auVar144._8_4_ = fVar236 * auVar111._8_4_ + fVar239 * auVar204._0_4_;
        auVar144._12_4_ = fVar218 * auVar111._12_4_ + fVar171 * auVar204._4_4_;
        auVar206._0_4_ = fVar235 * auVar260._0_4_ + fVar237 * fVar188;
        auVar206._4_4_ = fVar217 * auVar260._4_4_ + fVar219 * fVar189;
        auVar206._8_4_ = fVar236 * auVar260._8_4_ + fVar239 * fVar188;
        auVar206._12_4_ = fVar218 * auVar260._12_4_ + fVar171 * fVar189;
        auVar246._0_4_ = fVar235 * (float)local_488._0_4_ + fVar237 * auVar233._16_4_;
        auVar246._4_4_ = fVar217 * (float)local_488._4_4_ + fVar219 * auVar233._20_4_;
        auVar246._8_4_ = fVar236 * fStack_480 + fVar239 * auVar233._16_4_;
        auVar246._12_4_ = fVar218 * fStack_47c + fVar171 * auVar233._20_4_;
        auVar122 = vsubps_avx(auVar229,auVar81);
        auVar260 = vmovshdup_avx(auVar202);
        auVar151 = vmovsldup_avx(auVar202);
        auVar230._0_4_ = auVar151._0_4_ * auVar122._0_4_ + auVar81._0_4_ * auVar260._0_4_;
        auVar230._4_4_ = auVar151._4_4_ * auVar122._4_4_ + auVar81._4_4_ * auVar260._4_4_;
        auVar230._8_4_ = auVar151._8_4_ * auVar122._8_4_ + auVar81._8_4_ * auVar260._8_4_;
        auVar230._12_4_ = auVar151._12_4_ * auVar122._12_4_ + auVar81._12_4_ * auVar260._12_4_;
        _local_488 = vmovshdup_avx(auVar230);
        auVar81 = vsubps_avx(auVar144,auVar84);
        auVar164._0_4_ = auVar81._0_4_ * 3.0;
        auVar164._4_4_ = auVar81._4_4_ * 3.0;
        auVar164._8_4_ = auVar81._8_4_ * 3.0;
        auVar164._12_4_ = auVar81._12_4_ * 3.0;
        auVar81 = vsubps_avx(auVar206,auVar144);
        auVar264._0_4_ = auVar81._0_4_ * 3.0;
        auVar264._4_4_ = auVar81._4_4_ * 3.0;
        auVar264._8_4_ = auVar81._8_4_ * 3.0;
        auVar264._12_4_ = auVar81._12_4_ * 3.0;
        auVar81 = vsubps_avx(auVar246,auVar206);
        auVar276._0_4_ = auVar81._0_4_ * 3.0;
        auVar276._4_4_ = auVar81._4_4_ * 3.0;
        auVar276._8_4_ = auVar81._8_4_ * 3.0;
        auVar276._12_4_ = auVar81._12_4_ * 3.0;
        auVar260 = vminps_avx(auVar264,auVar276);
        auVar81 = vmaxps_avx(auVar264,auVar276);
        auVar260 = vminps_avx(auVar164,auVar260);
        auVar81 = vmaxps_avx(auVar164,auVar81);
        auVar151 = vshufpd_avx(auVar260,auVar260,3);
        auVar122 = vshufpd_avx(auVar81,auVar81,3);
        auVar260 = vminps_avx(auVar260,auVar151);
        auVar81 = vmaxps_avx(auVar81,auVar122);
        auVar151 = vshufps_avx(ZEXT416((uint)(1.0 / fVar216)),ZEXT416((uint)(1.0 / fVar216)),0);
        auVar265._0_4_ = auVar260._0_4_ * auVar151._0_4_;
        auVar265._4_4_ = auVar260._4_4_ * auVar151._4_4_;
        auVar265._8_4_ = auVar260._8_4_ * auVar151._8_4_;
        auVar265._12_4_ = auVar260._12_4_ * auVar151._12_4_;
        auVar277._0_4_ = auVar151._0_4_ * auVar81._0_4_;
        auVar277._4_4_ = auVar151._4_4_ * auVar81._4_4_;
        auVar277._8_4_ = auVar151._8_4_ * auVar81._8_4_;
        auVar277._12_4_ = auVar151._12_4_ * auVar81._12_4_;
        auVar112 = ZEXT416((uint)(1.0 / (local_488._0_4_ - auVar230._0_4_)));
        auVar81 = vshufpd_avx(auVar84,auVar84,3);
        auVar260 = vshufpd_avx(auVar144,auVar144,3);
        auVar151 = vshufpd_avx(auVar206,auVar206,3);
        auVar122 = vshufpd_avx(auVar246,auVar246,3);
        auVar81 = vsubps_avx(auVar81,auVar84);
        auVar111 = vsubps_avx(auVar260,auVar144);
        auVar141 = vsubps_avx(auVar151,auVar206);
        auVar122 = vsubps_avx(auVar122,auVar246);
        auVar260 = vminps_avx(auVar81,auVar111);
        auVar81 = vmaxps_avx(auVar81,auVar111);
        auVar151 = vminps_avx(auVar141,auVar122);
        auVar151 = vminps_avx(auVar260,auVar151);
        auVar260 = vmaxps_avx(auVar141,auVar122);
        auVar81 = vmaxps_avx(auVar81,auVar260);
        auVar260 = vshufps_avx(auVar112,auVar112,0);
        auVar315._0_4_ = auVar260._0_4_ * auVar151._0_4_;
        auVar315._4_4_ = auVar260._4_4_ * auVar151._4_4_;
        auVar315._8_4_ = auVar260._8_4_ * auVar151._8_4_;
        auVar315._12_4_ = auVar260._12_4_ * auVar151._12_4_;
        auVar322._0_4_ = auVar260._0_4_ * auVar81._0_4_;
        auVar322._4_4_ = auVar260._4_4_ * auVar81._4_4_;
        auVar322._8_4_ = auVar260._8_4_ * auVar81._8_4_;
        auVar322._12_4_ = auVar260._12_4_ * auVar81._12_4_;
        auVar81 = vmovsldup_avx(auVar230);
        auVar289._4_12_ = auVar81._4_12_;
        auVar289._0_4_ = fVar215;
        auVar296._4_12_ = auVar230._4_12_;
        auVar296._0_4_ = fVar234;
        auVar165._0_4_ = (fVar215 + fVar234) * 0.5;
        auVar165._4_4_ = (auVar81._4_4_ + auVar230._4_4_) * 0.5;
        auVar165._8_4_ = (auVar81._8_4_ + auVar230._8_4_) * 0.5;
        auVar165._12_4_ = (auVar81._12_4_ + auVar230._12_4_) * 0.5;
        auVar81 = vshufps_avx(auVar165,auVar165,0);
        fVar235 = auVar81._0_4_;
        fVar217 = auVar81._4_4_;
        fVar236 = auVar81._8_4_;
        fVar218 = auVar81._12_4_;
        auVar113._0_4_ = (float)local_468._0_4_ + fVar235 * (float)local_1e8._0_4_;
        auVar113._4_4_ = (float)local_468._4_4_ + fVar217 * (float)local_1e8._4_4_;
        auVar113._8_4_ = fStack_460 + fVar236 * fStack_1e0;
        auVar113._12_4_ = fStack_45c + fVar218 * fStack_1dc;
        auVar145._0_4_ = fVar235 * (float)local_1f8._0_4_ + (float)local_328._0_4_;
        auVar145._4_4_ = fVar217 * (float)local_1f8._4_4_ + (float)local_328._4_4_;
        auVar145._8_4_ = fVar236 * fStack_1f0 + fStack_320;
        auVar145._12_4_ = fVar218 * fStack_1ec + fStack_31c;
        auVar207._0_4_ = fVar235 * (float)local_208._0_4_ + (float)local_338._0_4_;
        auVar207._4_4_ = fVar217 * (float)local_208._4_4_ + (float)local_338._4_4_;
        auVar207._8_4_ = fVar236 * fStack_200 + fStack_330;
        auVar207._12_4_ = fVar218 * fStack_1fc + fStack_32c;
        auVar81 = vsubps_avx(auVar145,auVar113);
        auVar114._0_4_ = auVar113._0_4_ + fVar235 * auVar81._0_4_;
        auVar114._4_4_ = auVar113._4_4_ + fVar217 * auVar81._4_4_;
        auVar114._8_4_ = auVar113._8_4_ + fVar236 * auVar81._8_4_;
        auVar114._12_4_ = auVar113._12_4_ + fVar218 * auVar81._12_4_;
        auVar81 = vsubps_avx(auVar207,auVar145);
        auVar146._0_4_ = auVar145._0_4_ + fVar235 * auVar81._0_4_;
        auVar146._4_4_ = auVar145._4_4_ + fVar217 * auVar81._4_4_;
        auVar146._8_4_ = auVar145._8_4_ + fVar236 * auVar81._8_4_;
        auVar146._12_4_ = auVar145._12_4_ + fVar218 * auVar81._12_4_;
        auVar81 = vsubps_avx(auVar146,auVar114);
        fVar235 = auVar114._0_4_ + fVar235 * auVar81._0_4_;
        fVar217 = auVar114._4_4_ + fVar217 * auVar81._4_4_;
        auVar85._0_8_ = CONCAT44(fVar217,fVar235);
        auVar85._8_4_ = auVar114._8_4_ + fVar236 * auVar81._8_4_;
        auVar85._12_4_ = auVar114._12_4_ + fVar218 * auVar81._12_4_;
        fVar236 = auVar81._0_4_ * 3.0;
        fVar218 = auVar81._4_4_ * 3.0;
        auVar115._0_8_ = CONCAT44(fVar218,fVar236);
        auVar115._8_4_ = auVar81._8_4_ * 3.0;
        auVar115._12_4_ = auVar81._12_4_ * 3.0;
        auVar147._8_8_ = auVar85._0_8_;
        auVar147._0_8_ = auVar85._0_8_;
        auVar81 = vshufpd_avx(auVar85,auVar85,3);
        auVar260 = vshufps_avx(auVar165,auVar165,0x55);
        auVar141 = vsubps_avx(auVar81,auVar147);
        auVar305._0_4_ = auVar141._0_4_ * auVar260._0_4_ + fVar235;
        auVar305._4_4_ = auVar141._4_4_ * auVar260._4_4_ + fVar217;
        auVar305._8_4_ = auVar141._8_4_ * auVar260._8_4_ + fVar235;
        auVar305._12_4_ = auVar141._12_4_ * auVar260._12_4_ + fVar217;
        auVar148._8_8_ = auVar115._0_8_;
        auVar148._0_8_ = auVar115._0_8_;
        auVar81 = vshufpd_avx(auVar115,auVar115,1);
        auVar81 = vsubps_avx(auVar81,auVar148);
        auVar116._0_4_ = auVar81._0_4_ * auVar260._0_4_ + fVar236;
        auVar116._4_4_ = auVar81._4_4_ * auVar260._4_4_ + fVar218;
        auVar116._8_4_ = auVar81._8_4_ * auVar260._8_4_ + fVar236;
        auVar116._12_4_ = auVar81._12_4_ * auVar260._12_4_ + fVar218;
        auVar260 = vmovshdup_avx(auVar116);
        auVar208._0_8_ = auVar260._0_8_ ^ 0x8000000080000000;
        auVar208._8_4_ = auVar260._8_4_ ^ 0x80000000;
        auVar208._12_4_ = auVar260._12_4_ ^ 0x80000000;
        auVar151 = vmovshdup_avx(auVar141);
        auVar81 = vunpcklps_avx(auVar151,auVar208);
        auVar122 = vshufps_avx(auVar81,auVar208,4);
        auVar86._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
        auVar86._8_4_ = -auVar141._8_4_;
        auVar86._12_4_ = -auVar141._12_4_;
        auVar81 = vmovlhps_avx(auVar86,auVar116);
        auVar111 = vshufps_avx(auVar81,auVar116,8);
        auVar81 = ZEXT416((uint)(auVar116._0_4_ * auVar151._0_4_ - auVar141._0_4_ * auVar260._0_4_))
        ;
        auVar260 = vshufps_avx(auVar81,auVar81,0);
        auVar81 = vdivps_avx(auVar122,auVar260);
        auVar260 = vdivps_avx(auVar111,auVar260);
        auVar111 = vinsertps_avx(auVar265,auVar315,0x1c);
        auVar141 = vinsertps_avx(auVar277,auVar322,0x1c);
        auVar112 = vinsertps_avx(auVar315,auVar265,0x4c);
        auVar238 = vinsertps_avx(auVar322,auVar277,0x4c);
        auVar151 = vmovsldup_avx(auVar81);
        auVar278._0_4_ = auVar111._0_4_ * auVar151._0_4_;
        auVar278._4_4_ = auVar111._4_4_ * auVar151._4_4_;
        auVar278._8_4_ = auVar111._8_4_ * auVar151._8_4_;
        auVar278._12_4_ = auVar111._12_4_ * auVar151._12_4_;
        auVar117._0_4_ = auVar151._0_4_ * auVar141._0_4_;
        auVar117._4_4_ = auVar151._4_4_ * auVar141._4_4_;
        auVar117._8_4_ = auVar151._8_4_ * auVar141._8_4_;
        auVar117._12_4_ = auVar151._12_4_ * auVar141._12_4_;
        auVar122 = vminps_avx(auVar278,auVar117);
        auVar151 = vmaxps_avx(auVar117,auVar278);
        auVar5 = vmovsldup_avx(auVar260);
        auVar323._0_4_ = auVar5._0_4_ * auVar112._0_4_;
        auVar323._4_4_ = auVar5._4_4_ * auVar112._4_4_;
        auVar323._8_4_ = auVar5._8_4_ * auVar112._8_4_;
        auVar323._12_4_ = auVar5._12_4_ * auVar112._12_4_;
        auVar279._0_4_ = auVar5._0_4_ * auVar238._0_4_;
        auVar279._4_4_ = auVar5._4_4_ * auVar238._4_4_;
        auVar279._8_4_ = auVar5._8_4_ * auVar238._8_4_;
        auVar279._12_4_ = auVar5._12_4_ * auVar238._12_4_;
        auVar5 = vminps_avx(auVar323,auVar279);
        auVar178._0_4_ = auVar122._0_4_ + auVar5._0_4_;
        auVar178._4_4_ = auVar122._4_4_ + auVar5._4_4_;
        auVar178._8_4_ = auVar122._8_4_ + auVar5._8_4_;
        auVar178._12_4_ = auVar122._12_4_ + auVar5._12_4_;
        auVar122 = vmaxps_avx(auVar279,auVar323);
        auVar5 = vsubps_avx(auVar289,auVar165);
        auVar261 = vsubps_avx(auVar296,auVar165);
        auVar118._0_4_ = auVar122._0_4_ + auVar151._0_4_;
        auVar118._4_4_ = auVar122._4_4_ + auVar151._4_4_;
        auVar118._8_4_ = auVar122._8_4_ + auVar151._8_4_;
        auVar118._12_4_ = auVar122._12_4_ + auVar151._12_4_;
        auVar297._8_8_ = 0x3f800000;
        auVar297._0_8_ = 0x3f800000;
        auVar151 = vsubps_avx(auVar297,auVar118);
        auVar122 = vsubps_avx(auVar297,auVar178);
        fVar239 = auVar5._0_4_;
        auVar298._0_4_ = fVar239 * auVar151._0_4_;
        fVar171 = auVar5._4_4_;
        auVar298._4_4_ = fVar171 * auVar151._4_4_;
        fVar188 = auVar5._8_4_;
        auVar298._8_4_ = fVar188 * auVar151._8_4_;
        fVar189 = auVar5._12_4_;
        auVar298._12_4_ = fVar189 * auVar151._12_4_;
        fVar236 = auVar261._0_4_;
        auVar119._0_4_ = fVar236 * auVar151._0_4_;
        fVar218 = auVar261._4_4_;
        auVar119._4_4_ = fVar218 * auVar151._4_4_;
        fVar237 = auVar261._8_4_;
        auVar119._8_4_ = fVar237 * auVar151._8_4_;
        fVar219 = auVar261._12_4_;
        auVar119._12_4_ = fVar219 * auVar151._12_4_;
        auVar316._0_4_ = fVar239 * auVar122._0_4_;
        auVar316._4_4_ = fVar171 * auVar122._4_4_;
        auVar316._8_4_ = fVar188 * auVar122._8_4_;
        auVar316._12_4_ = fVar189 * auVar122._12_4_;
        auVar179._0_4_ = fVar236 * auVar122._0_4_;
        auVar179._4_4_ = fVar218 * auVar122._4_4_;
        auVar179._8_4_ = fVar237 * auVar122._8_4_;
        auVar179._12_4_ = fVar219 * auVar122._12_4_;
        auVar151 = vminps_avx(auVar298,auVar316);
        auVar122 = vminps_avx(auVar119,auVar179);
        auVar5 = vminps_avx(auVar151,auVar122);
        auVar151 = vmaxps_avx(auVar316,auVar298);
        auVar122 = vmaxps_avx(auVar179,auVar119);
        auVar261 = vshufps_avx(auVar165,auVar165,0x54);
        auVar122 = vmaxps_avx(auVar122,auVar151);
        auVar201 = vshufps_avx(auVar305,auVar305,0);
        auVar6 = vshufps_avx(auVar305,auVar305,0x55);
        auVar151 = vhaddps_avx(auVar5,auVar5);
        auVar122 = vhaddps_avx(auVar122,auVar122);
        auVar180._0_4_ = auVar6._0_4_ * auVar260._0_4_ + auVar201._0_4_ * auVar81._0_4_;
        auVar180._4_4_ = auVar6._4_4_ * auVar260._4_4_ + auVar201._4_4_ * auVar81._4_4_;
        auVar180._8_4_ = auVar6._8_4_ * auVar260._8_4_ + auVar201._8_4_ * auVar81._8_4_;
        auVar180._12_4_ = auVar6._12_4_ * auVar260._12_4_ + auVar201._12_4_ * auVar81._12_4_;
        auVar5 = vsubps_avx(auVar261,auVar180);
        fVar235 = auVar5._0_4_ + auVar151._0_4_;
        fVar217 = auVar5._0_4_ + auVar122._0_4_;
        auVar151 = vmaxss_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar235));
        auVar122 = vminss_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar234));
      } while (auVar122._0_4_ < auVar151._0_4_);
      auVar151 = vmovshdup_avx(auVar81);
      auVar181._0_4_ = auVar111._0_4_ * auVar151._0_4_;
      auVar181._4_4_ = auVar111._4_4_ * auVar151._4_4_;
      auVar181._8_4_ = auVar111._8_4_ * auVar151._8_4_;
      auVar181._12_4_ = auVar111._12_4_ * auVar151._12_4_;
      auVar120._0_4_ = auVar151._0_4_ * auVar141._0_4_;
      auVar120._4_4_ = auVar151._4_4_ * auVar141._4_4_;
      auVar120._8_4_ = auVar151._8_4_ * auVar141._8_4_;
      auVar120._12_4_ = auVar151._12_4_ * auVar141._12_4_;
      auVar122 = vminps_avx(auVar181,auVar120);
      auVar151 = vmaxps_avx(auVar120,auVar181);
      auVar111 = vmovshdup_avx(auVar260);
      auVar87._0_4_ = auVar111._0_4_ * auVar112._0_4_;
      auVar87._4_4_ = auVar111._4_4_ * auVar112._4_4_;
      auVar87._8_4_ = auVar111._8_4_ * auVar112._8_4_;
      auVar87._12_4_ = auVar111._12_4_ * auVar112._12_4_;
      auVar182._0_4_ = auVar238._0_4_ * auVar111._0_4_;
      auVar182._4_4_ = auVar238._4_4_ * auVar111._4_4_;
      auVar182._8_4_ = auVar238._8_4_ * auVar111._8_4_;
      auVar182._12_4_ = auVar238._12_4_ * auVar111._12_4_;
      auVar111 = vminps_avx(auVar87,auVar182);
      auVar149._0_4_ = auVar122._0_4_ + auVar111._0_4_;
      auVar149._4_4_ = auVar122._4_4_ + auVar111._4_4_;
      auVar149._8_4_ = auVar122._8_4_ + auVar111._8_4_;
      auVar149._12_4_ = auVar122._12_4_ + auVar111._12_4_;
      auVar122 = vmaxps_avx(auVar182,auVar87);
      auVar88._0_4_ = auVar151._0_4_ + auVar122._0_4_;
      auVar88._4_4_ = auVar151._4_4_ + auVar122._4_4_;
      auVar88._8_4_ = auVar151._8_4_ + auVar122._8_4_;
      auVar88._12_4_ = auVar151._12_4_ + auVar122._12_4_;
      auVar151 = vsubps_avx(_local_358,auVar88);
      auVar122 = vsubps_avx(_local_358,auVar149);
      auVar150._0_4_ = fVar239 * auVar151._0_4_;
      auVar150._4_4_ = fVar171 * auVar151._4_4_;
      auVar150._8_4_ = fVar188 * auVar151._8_4_;
      auVar150._12_4_ = fVar189 * auVar151._12_4_;
      auVar183._0_4_ = fVar239 * auVar122._0_4_;
      auVar183._4_4_ = fVar171 * auVar122._4_4_;
      auVar183._8_4_ = fVar188 * auVar122._8_4_;
      auVar183._12_4_ = fVar189 * auVar122._12_4_;
      auVar89._0_4_ = fVar236 * auVar151._0_4_;
      auVar89._4_4_ = fVar218 * auVar151._4_4_;
      auVar89._8_4_ = fVar237 * auVar151._8_4_;
      auVar89._12_4_ = fVar219 * auVar151._12_4_;
      auVar121._0_4_ = fVar236 * auVar122._0_4_;
      auVar121._4_4_ = fVar218 * auVar122._4_4_;
      auVar121._8_4_ = fVar237 * auVar122._8_4_;
      auVar121._12_4_ = fVar219 * auVar122._12_4_;
      auVar151 = vminps_avx(auVar150,auVar183);
      auVar122 = vminps_avx(auVar89,auVar121);
      auVar151 = vminps_avx(auVar151,auVar122);
      auVar122 = vmaxps_avx(auVar183,auVar150);
      auVar111 = vmaxps_avx(auVar121,auVar89);
      auVar151 = vhaddps_avx(auVar151,auVar151);
      auVar122 = vmaxps_avx(auVar111,auVar122);
      auVar122 = vhaddps_avx(auVar122,auVar122);
      auVar111 = vmovshdup_avx(auVar5);
      auVar141 = ZEXT416((uint)(auVar111._0_4_ + auVar151._0_4_));
      auVar151 = vmaxss_avx(auVar230,auVar141);
      auVar111 = ZEXT416((uint)(auVar111._0_4_ + auVar122._0_4_));
      auVar122 = vminss_avx(auVar111,_local_488);
      auVar266._8_4_ = 0x7fffffff;
      auVar266._0_8_ = 0x7fffffff7fffffff;
      auVar266._12_4_ = 0x7fffffff;
    } while (auVar122._0_4_ < auVar151._0_4_);
    uVar68 = 0;
    if ((fVar215 < fVar235) && (fVar217 < fVar234)) {
      auVar151 = vcmpps_avx(auVar111,_local_488,1);
      auVar122 = vcmpps_avx(auVar230,auVar141,1);
      auVar151 = vandps_avx(auVar122,auVar151);
      uVar68 = auVar151._0_4_;
    }
    if ((3 < uVar65 || fVar216 < 0.001) || (uVar68 & 1) != 0) {
      lVar69 = 200;
      do {
        fVar221 = auVar5._0_4_;
        fVar194 = 1.0 - fVar221;
        auVar151 = ZEXT416((uint)(fVar194 * fVar194 * fVar194));
        auVar151 = vshufps_avx(auVar151,auVar151,0);
        auVar122 = ZEXT416((uint)(fVar221 * 3.0 * fVar194 * fVar194));
        auVar122 = vshufps_avx(auVar122,auVar122,0);
        auVar111 = ZEXT416((uint)(fVar194 * fVar221 * fVar221 * 3.0));
        auVar111 = vshufps_avx(auVar111,auVar111,0);
        auVar141 = ZEXT416((uint)(fVar221 * fVar221 * fVar221));
        auVar141 = vshufps_avx(auVar141,auVar141,0);
        fVar194 = (float)local_468._0_4_ * auVar151._0_4_ +
                  (float)local_328._0_4_ * auVar122._0_4_ +
                  (float)local_2c8._0_4_ * auVar141._0_4_ + (float)local_338._0_4_ * auVar111._0_4_;
        fVar221 = (float)local_468._4_4_ * auVar151._4_4_ +
                  (float)local_328._4_4_ * auVar122._4_4_ +
                  (float)local_2c8._4_4_ * auVar141._4_4_ + (float)local_338._4_4_ * auVar111._4_4_;
        auVar90._0_8_ = CONCAT44(fVar221,fVar194);
        auVar90._8_4_ =
             fStack_460 * auVar151._8_4_ +
             fStack_320 * auVar122._8_4_ + fStack_2c0 * auVar141._8_4_ + fStack_330 * auVar111._8_4_
        ;
        auVar90._12_4_ =
             fStack_45c * auVar151._12_4_ +
             fStack_31c * auVar122._12_4_ +
             fStack_2bc * auVar141._12_4_ + fStack_32c * auVar111._12_4_;
        auVar123._8_8_ = auVar90._0_8_;
        auVar123._0_8_ = auVar90._0_8_;
        auVar122 = vshufpd_avx(auVar90,auVar90,1);
        auVar151 = vmovshdup_avx(auVar5);
        auVar122 = vsubps_avx(auVar122,auVar123);
        auVar91._0_4_ = auVar151._0_4_ * auVar122._0_4_ + fVar194;
        auVar91._4_4_ = auVar151._4_4_ * auVar122._4_4_ + fVar221;
        auVar91._8_4_ = auVar151._8_4_ * auVar122._8_4_ + fVar194;
        auVar91._12_4_ = auVar151._12_4_ * auVar122._12_4_ + fVar221;
        auVar151 = vshufps_avx(auVar91,auVar91,0);
        auVar122 = vshufps_avx(auVar91,auVar91,0x55);
        auVar124._0_4_ = auVar81._0_4_ * auVar151._0_4_ + auVar260._0_4_ * auVar122._0_4_;
        auVar124._4_4_ = auVar81._4_4_ * auVar151._4_4_ + auVar260._4_4_ * auVar122._4_4_;
        auVar124._8_4_ = auVar81._8_4_ * auVar151._8_4_ + auVar260._8_4_ * auVar122._8_4_;
        auVar124._12_4_ = auVar81._12_4_ * auVar151._12_4_ + auVar260._12_4_ * auVar122._12_4_;
        auVar5 = vsubps_avx(auVar5,auVar124);
        auVar151 = vandps_avx(auVar266,auVar91);
        auVar122 = vshufps_avx(auVar151,auVar151,0xf5);
        auVar151 = vmaxss_avx(auVar122,auVar151);
        if (auVar151._0_4_ < (float)local_4c8._0_4_) {
          fVar194 = auVar5._0_4_;
          if ((0.0 <= fVar194) && (fVar194 <= 1.0)) {
            auVar81 = vmovshdup_avx(auVar5);
            fVar221 = auVar81._0_4_;
            if ((0.0 <= fVar221) && (fVar221 <= 1.0)) {
              auVar81 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                      ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
              auVar238 = vinsertps_avx(auVar81,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),
                                       0x28);
              aVar4 = (ray->org).field_0;
              auVar81 = vsubps_avx(_local_3c8,(undefined1  [16])aVar4);
              auVar81 = vdpps_avx(auVar81,auVar238,0x7f);
              auVar260 = vsubps_avx(_local_3f8,(undefined1  [16])aVar4);
              auVar260 = vdpps_avx(auVar260,auVar238,0x7f);
              auVar151 = vsubps_avx(_local_408,(undefined1  [16])aVar4);
              auVar151 = vdpps_avx(auVar151,auVar238,0x7f);
              auVar122 = vsubps_avx(_local_3e8,(undefined1  [16])aVar4);
              auVar122 = vdpps_avx(auVar122,auVar238,0x7f);
              auVar111 = vsubps_avx(_local_3d8,(undefined1  [16])aVar4);
              auVar111 = vdpps_avx(auVar111,auVar238,0x7f);
              auVar141 = vsubps_avx(_local_418,(undefined1  [16])aVar4);
              auVar141 = vdpps_avx(auVar141,auVar238,0x7f);
              auVar112 = vsubps_avx(_local_2d8,(undefined1  [16])aVar4);
              auVar112 = vdpps_avx(auVar112,auVar238,0x7f);
              auVar63._4_4_ = fStack_4a4;
              auVar63._0_4_ = local_4a8;
              auVar63._8_4_ = fStack_4a0;
              auVar63._12_4_ = fStack_49c;
              auVar261 = vsubps_avx(auVar63,(undefined1  [16])aVar4);
              auVar238 = vdpps_avx(auVar261,auVar238,0x7f);
              fVar217 = 1.0 - fVar221;
              fVar236 = 1.0 - fVar194;
              fVar215 = auVar5._4_4_;
              fVar234 = auVar5._8_4_;
              fVar216 = auVar5._12_4_;
              fVar235 = fVar236 * fVar194 * fVar194 * 3.0;
              auVar209._0_4_ = fVar194 * fVar194 * fVar194;
              auVar209._4_4_ = fVar215 * fVar215 * fVar215;
              auVar209._8_4_ = fVar234 * fVar234 * fVar234;
              auVar209._12_4_ = fVar216 * fVar216 * fVar216;
              fVar215 = fVar194 * 3.0 * fVar236 * fVar236;
              fVar234 = fVar236 * fVar236 * fVar236;
              fVar194 = (fVar217 * auVar81._0_4_ + auVar111._0_4_ * fVar221) * fVar234 +
                        fVar215 * (auVar141._0_4_ * fVar221 + fVar217 * auVar260._0_4_) +
                        fVar235 * (auVar112._0_4_ * fVar221 + fVar217 * auVar151._0_4_) +
                        auVar209._0_4_ * (fVar217 * auVar122._0_4_ + fVar221 * auVar238._0_4_);
              if (((ray->org).field_0.m128[3] <= fVar194) &&
                 (fVar221 = ray->tfar, fVar194 <= fVar221)) {
                pGVar8 = (context->scene->geometries).items[local_4b0].ptr;
                if ((pGVar8->mask & ray->mask) == 0) {
LAB_01093d9e:
                  bVar64 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar64 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar81 = vshufps_avx(auVar5,auVar5,0x55);
                  auVar267._8_4_ = 0x3f800000;
                  auVar267._0_8_ = 0x3f8000003f800000;
                  auVar267._12_4_ = 0x3f800000;
                  auVar260 = vsubps_avx(auVar267,auVar81);
                  fVar216 = auVar81._0_4_;
                  fVar217 = auVar81._4_4_;
                  fVar218 = auVar81._8_4_;
                  fVar237 = auVar81._12_4_;
                  fVar219 = auVar260._0_4_;
                  fVar239 = auVar260._4_4_;
                  fVar220 = auVar260._8_4_;
                  fVar240 = auVar260._12_4_;
                  auVar280._0_4_ =
                       fVar216 * (float)local_3d8._0_4_ + fVar219 * (float)local_3c8._0_4_;
                  auVar280._4_4_ =
                       fVar217 * (float)local_3d8._4_4_ + fVar239 * (float)local_3c8._4_4_;
                  auVar280._8_4_ = fVar218 * fStack_3d0 + fVar220 * fStack_3c0;
                  auVar280._12_4_ = fVar237 * fStack_3cc + fVar240 * fStack_3bc;
                  auVar290._0_4_ =
                       fVar216 * (float)local_418._0_4_ + fVar219 * (float)local_3f8._0_4_;
                  auVar290._4_4_ =
                       fVar217 * (float)local_418._4_4_ + fVar239 * (float)local_3f8._4_4_;
                  auVar290._8_4_ = fVar218 * fStack_410 + fVar220 * fStack_3f0;
                  auVar290._12_4_ = fVar237 * fStack_40c + fVar240 * fStack_3ec;
                  auVar299._0_4_ =
                       fVar216 * (float)local_2d8._0_4_ + fVar219 * (float)local_408._0_4_;
                  auVar299._4_4_ =
                       fVar217 * (float)local_2d8._4_4_ + fVar239 * (float)local_408._4_4_;
                  auVar299._8_4_ = fVar218 * fStack_2d0 + fVar220 * fStack_400;
                  auVar299._12_4_ = fVar237 * fStack_2cc + fVar240 * fStack_3fc;
                  auVar247._0_4_ = fVar219 * (float)local_3e8._0_4_ + fVar216 * local_4a8;
                  auVar247._4_4_ = fVar239 * (float)local_3e8._4_4_ + fVar217 * fStack_4a4;
                  auVar247._8_4_ = fVar220 * fStack_3e0 + fVar218 * fStack_4a0;
                  auVar247._12_4_ = fVar240 * fStack_3dc + fVar237 * fStack_49c;
                  auVar122 = vsubps_avx(auVar290,auVar280);
                  auVar111 = vsubps_avx(auVar299,auVar290);
                  auVar141 = vsubps_avx(auVar247,auVar299);
                  auVar81 = vshufps_avx(auVar5,auVar5,0);
                  fVar237 = auVar81._0_4_;
                  fVar219 = auVar81._4_4_;
                  fVar239 = auVar81._8_4_;
                  fVar220 = auVar81._12_4_;
                  auVar81 = vshufps_avx(ZEXT416((uint)fVar236),ZEXT416((uint)fVar236),0);
                  fVar216 = auVar81._0_4_;
                  fVar217 = auVar81._4_4_;
                  fVar236 = auVar81._8_4_;
                  fVar218 = auVar81._12_4_;
                  auVar81 = vshufps_avx(auVar209,auVar209,0);
                  auVar260 = vshufps_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),0);
                  auVar151 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
                  auVar184._0_4_ =
                       ((auVar122._0_4_ * fVar216 + fVar237 * auVar111._0_4_) * fVar216 +
                       fVar237 * (auVar111._0_4_ * fVar216 + fVar237 * auVar141._0_4_)) * 3.0;
                  auVar184._4_4_ =
                       ((auVar122._4_4_ * fVar217 + fVar219 * auVar111._4_4_) * fVar217 +
                       fVar219 * (auVar111._4_4_ * fVar217 + fVar219 * auVar141._4_4_)) * 3.0;
                  auVar184._8_4_ =
                       ((auVar122._8_4_ * fVar236 + fVar239 * auVar111._8_4_) * fVar236 +
                       fVar239 * (auVar111._8_4_ * fVar236 + fVar239 * auVar141._8_4_)) * 3.0;
                  auVar184._12_4_ =
                       ((auVar122._12_4_ * fVar218 + fVar220 * auVar111._12_4_) * fVar218 +
                       fVar220 * (auVar111._12_4_ * fVar218 + fVar220 * auVar141._12_4_)) * 3.0;
                  auVar122 = vshufps_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar234),0);
                  auVar125._0_4_ =
                       auVar122._0_4_ * (float)local_228._0_4_ +
                       auVar151._0_4_ * (float)local_238._0_4_ +
                       auVar81._0_4_ * (float)local_258._0_4_ +
                       auVar260._0_4_ * (float)local_248._0_4_;
                  auVar125._4_4_ =
                       auVar122._4_4_ * (float)local_228._4_4_ +
                       auVar151._4_4_ * (float)local_238._4_4_ +
                       auVar81._4_4_ * (float)local_258._4_4_ +
                       auVar260._4_4_ * (float)local_248._4_4_;
                  auVar125._8_4_ =
                       auVar122._8_4_ * fStack_220 +
                       auVar151._8_4_ * fStack_230 +
                       auVar81._8_4_ * fStack_250 + auVar260._8_4_ * fStack_240;
                  auVar125._12_4_ =
                       auVar122._12_4_ * fStack_21c +
                       auVar151._12_4_ * fStack_22c +
                       auVar81._12_4_ * fStack_24c + auVar260._12_4_ * fStack_23c;
                  auVar81 = vshufps_avx(auVar184,auVar184,0xc9);
                  auVar152._0_4_ = auVar125._0_4_ * auVar81._0_4_;
                  auVar152._4_4_ = auVar125._4_4_ * auVar81._4_4_;
                  auVar152._8_4_ = auVar125._8_4_ * auVar81._8_4_;
                  auVar152._12_4_ = auVar125._12_4_ * auVar81._12_4_;
                  auVar81 = vshufps_avx(auVar125,auVar125,0xc9);
                  auVar126._0_4_ = auVar184._0_4_ * auVar81._0_4_;
                  auVar126._4_4_ = auVar184._4_4_ * auVar81._4_4_;
                  auVar126._8_4_ = auVar184._8_4_ * auVar81._8_4_;
                  auVar126._12_4_ = auVar184._12_4_ * auVar81._12_4_;
                  auVar260 = vsubps_avx(auVar126,auVar152);
                  auVar81 = vshufps_avx(auVar260,auVar260,0xe9);
                  local_288 = vmovlps_avx(auVar81);
                  local_280 = auVar260._0_4_;
                  local_27c = vmovlps_avx(auVar5);
                  local_274 = (int)local_310;
                  local_270 = (int)local_4b0;
                  local_26c = context->user->instID[0];
                  local_268 = context->user->instPrimID[0];
                  ray->tfar = fVar194;
                  local_4cc = -1;
                  local_308.valid = &local_4cc;
                  local_308.geometryUserPtr = pGVar8->userPtr;
                  local_308.context = context->user;
                  local_308.hit = (RTCHitN *)&local_288;
                  local_308.N = 1;
                  local_308.ray = (RTCRayN *)ray;
                  if ((pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar8->occlusionFilterN)(&local_308), *local_308.valid != 0)) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 == (RTCFilterFunctionN)0x0) ||
                       ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar8->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*p_Var9)(&local_308), *local_308.valid != 0)))) {
                      bVar64 = 1;
                      goto LAB_01093da0;
                    }
                  }
                  ray->tfar = fVar221;
                  goto LAB_01093d9e;
                }
LAB_01093da0:
                bVar67 = (bool)(bVar67 | bVar64);
              }
            }
          }
          break;
        }
        lVar69 = lVar69 + -1;
      } while (lVar69 != 0);
      goto LAB_01092e88;
    }
    auVar81 = vinsertps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar234),0x10);
    auVar318 = ZEXT1664(auVar81);
    auVar255 = ZEXT1664(local_378);
    auVar269 = ZEXT1664(local_388);
    auVar158 = ZEXT1664(_local_368);
    auVar284 = ZEXT1664(local_398);
    auVar303 = ZEXT1664(local_3a8);
    auVar307 = ZEXT1664(local_3b8);
    auVar214 = ZEXT1664(auVar230);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }